

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O3

void embree::avx512::CurveNiIntersectorK<4,8>::
     intersect_n<embree::avx512::OrientedCurve1IntersectorK<embree::CatmullRomCurveT,8>,embree::avx512::Intersect1KEpilog1<8,true>>
               (Precalculations *pre,RayHitK<8> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar1;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar2;
  Primitive PVar3;
  uint uVar4;
  uint uVar5;
  Geometry *pGVar6;
  RTCFilterFunctionN p_Var7;
  void *pvVar8;
  __int_type_conflict _Var9;
  bool bVar10;
  bool bVar11;
  undefined1 auVar12 [16];
  undefined8 uVar13;
  undefined8 uVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  int iVar21;
  int iVar22;
  int iVar23;
  int iVar24;
  int iVar25;
  int iVar26;
  int iVar27;
  byte bVar28;
  uint uVar29;
  ulong uVar30;
  long lVar32;
  uint uVar33;
  ulong uVar34;
  ulong uVar35;
  uint uVar36;
  bool bVar37;
  bool bVar38;
  bool bVar39;
  bool bVar40;
  bool bVar41;
  ulong uVar42;
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar94 [32];
  undefined1 auVar96 [32];
  undefined1 auVar98 [32];
  undefined1 auVar100 [32];
  float fVar102;
  vint4 bi_2;
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined4 uVar109;
  vint4 bi_1;
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  float fVar117;
  float fVar125;
  float fVar126;
  vint4 bi;
  undefined1 auVar118 [16];
  float fVar127;
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [32];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  float fVar138;
  float fVar144;
  float fVar145;
  vint4 ai_2;
  undefined1 auVar139 [16];
  float fVar146;
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [32];
  vint4 ai;
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [32];
  vint4 ai_1;
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  vfloat4 a0_2;
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [32];
  float fVar202;
  float fVar211;
  float fVar212;
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  float fVar213;
  float fVar214;
  float fVar224;
  float fVar225;
  float fVar226;
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  float fVar227;
  float fVar232;
  float fVar233;
  vfloat4 a0;
  undefined1 auVar228 [16];
  float fVar234;
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  vfloat4 a0_1;
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  undefined1 auVar244 [64];
  undefined1 auVar245 [64];
  undefined1 auVar246 [64];
  undefined1 auVar247 [64];
  undefined1 auVar248 [64];
  undefined1 auVar249 [64];
  undefined1 in_ZMM29 [64];
  undefined1 auVar250 [64];
  undefined1 auVar251 [64];
  undefined1 auVar252 [64];
  vfloat_impl<4> p00;
  RTCFilterFunctionNArguments args;
  vfloat_impl<4> p02;
  vfloat_impl<4> p01;
  uint mask_stack [4];
  vfloat_impl<4> p03;
  BBox1f cu_stack [4];
  BBox1f cv_stack [4];
  RTCFilterFunctionNArguments local_480;
  undefined1 local_450 [16];
  undefined1 local_440 [16];
  uint auStack_430 [4];
  undefined1 local_420 [32];
  undefined1 local_400 [16];
  undefined1 local_3f0 [8];
  float fStack_3e8;
  float fStack_3e4;
  undefined1 local_3e0 [16];
  undefined1 local_3d0 [16];
  undefined1 local_3c0 [16];
  undefined1 local_3b0 [8];
  float fStack_3a8;
  float fStack_3a4;
  undefined1 local_3a0 [8];
  float fStack_398;
  float fStack_394;
  undefined1 local_390 [16];
  undefined1 local_380 [16];
  undefined1 local_370 [8];
  float fStack_368;
  float fStack_364;
  undefined1 local_360 [16];
  undefined1 local_350 [8];
  float fStack_348;
  float fStack_344;
  undefined1 local_340 [16];
  undefined1 local_330 [16];
  undefined1 local_320 [16];
  undefined1 local_310 [16];
  undefined1 local_300 [16];
  undefined1 local_2f0 [16];
  undefined1 local_2e0 [16];
  undefined1 local_2d0 [16];
  undefined1 local_2c0 [16];
  undefined1 local_2b0 [16];
  undefined1 local_2a0 [16];
  undefined1 local_290 [16];
  undefined1 local_280 [16];
  undefined1 local_270 [8];
  float fStack_268;
  float fStack_264;
  undefined8 uStack_260;
  undefined1 local_240 [32];
  undefined1 local_220 [32];
  undefined1 local_200 [32];
  undefined4 local_1e0;
  undefined4 uStack_1dc;
  undefined4 uStack_1d8;
  undefined4 uStack_1d4;
  undefined4 uStack_1d0;
  undefined4 uStack_1cc;
  undefined4 uStack_1c8;
  undefined4 uStack_1c4;
  undefined1 local_1c0 [32];
  ulong auStack_1a0 [4];
  RTCHitN local_180 [32];
  undefined1 local_160 [32];
  undefined4 local_140;
  undefined4 uStack_13c;
  undefined4 uStack_138;
  undefined4 uStack_134;
  undefined4 uStack_130;
  undefined4 uStack_12c;
  undefined4 uStack_128;
  undefined4 uStack_124;
  float local_120;
  float fStack_11c;
  float fStack_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  float fStack_108;
  float fStack_104;
  undefined1 local_100 [32];
  undefined8 local_e0;
  undefined8 uStack_d8;
  undefined8 uStack_d0;
  undefined8 uStack_c8;
  undefined1 local_c0 [32];
  uint local_a0;
  uint uStack_9c;
  uint uStack_98;
  uint uStack_94;
  uint uStack_90;
  uint uStack_8c;
  uint uStack_88;
  uint uStack_84;
  uint local_80;
  uint uStack_7c;
  uint uStack_78;
  uint uStack_74;
  uint uStack_70;
  uint uStack_6c;
  uint uStack_68;
  uint uStack_64;
  ulong uVar31;
  undefined1 auVar93 [32];
  undefined1 auVar95 [32];
  undefined1 auVar97 [32];
  undefined1 auVar99 [32];
  undefined1 auVar101 [32];
  
  PVar3 = prim[1];
  uVar35 = (ulong)(byte)PVar3;
  fVar102 = *(float *)(prim + uVar35 * 0x19 + 0x12);
  auVar43 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                          0x10);
  auVar43 = vinsertps_avx(auVar43,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x20);
  auVar44 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x80)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0xa0)),0x10);
  auVar44 = vinsertps_avx(auVar44,ZEXT416(*(uint *)(ray + k * 4 + 0xc0)),0x20);
  auVar43 = vsubps_avx(auVar43,*(undefined1 (*) [16])(prim + uVar35 * 0x19 + 6));
  auVar63._0_4_ = fVar102 * auVar43._0_4_;
  auVar63._4_4_ = fVar102 * auVar43._4_4_;
  auVar63._8_4_ = fVar102 * auVar43._8_4_;
  auVar63._12_4_ = fVar102 * auVar43._12_4_;
  auVar50._0_4_ = fVar102 * auVar44._0_4_;
  auVar50._4_4_ = fVar102 * auVar44._4_4_;
  auVar50._8_4_ = fVar102 * auVar44._8_4_;
  auVar50._12_4_ = fVar102 * auVar44._12_4_;
  auVar43 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar35 * 4 + 6)));
  auVar43 = vcvtdq2ps_avx(auVar43);
  auVar44 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar35 * 5 + 6)));
  auVar44 = vcvtdq2ps_avx(auVar44);
  auVar45 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar35 * 6 + 6)));
  auVar56 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar35 * 0xb + 6)));
  auVar45 = vcvtdq2ps_avx(auVar45);
  auVar56 = vcvtdq2ps_avx(auVar56);
  auVar55 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)((uint)(byte)PVar3 * 0xc) + 6)));
  auVar55 = vcvtdq2ps_avx(auVar55);
  auVar54 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (uint)(byte)PVar3 * 0xc + uVar35 + 6)));
  auVar54 = vcvtdq2ps_avx(auVar54);
  uVar42 = (ulong)(uint)((int)(uVar35 * 9) * 2);
  auVar61 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar42 + 6)));
  auVar61 = vcvtdq2ps_avx(auVar61);
  auVar53 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar42 + uVar35 + 6)));
  auVar53 = vcvtdq2ps_avx(auVar53);
  uVar30 = (ulong)(uint)((int)(uVar35 * 5) << 2);
  auVar12 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar30 + 6)));
  auVar12 = vcvtdq2ps_avx(auVar12);
  auVar67._4_4_ = auVar50._0_4_;
  auVar67._0_4_ = auVar50._0_4_;
  auVar67._8_4_ = auVar50._0_4_;
  auVar67._12_4_ = auVar50._0_4_;
  auVar48 = vshufps_avx(auVar50,auVar50,0x55);
  auVar46 = vshufps_avx(auVar50,auVar50,0xaa);
  fVar102 = auVar46._0_4_;
  auVar59._0_4_ = fVar102 * auVar45._0_4_;
  fVar213 = auVar46._4_4_;
  auVar59._4_4_ = fVar213 * auVar45._4_4_;
  fVar202 = auVar46._8_4_;
  auVar59._8_4_ = fVar202 * auVar45._8_4_;
  fVar211 = auVar46._12_4_;
  auVar59._12_4_ = fVar211 * auVar45._12_4_;
  auVar66._0_4_ = auVar54._0_4_ * fVar102;
  auVar66._4_4_ = auVar54._4_4_ * fVar213;
  auVar66._8_4_ = auVar54._8_4_ * fVar202;
  auVar66._12_4_ = auVar54._12_4_ * fVar211;
  auVar51._0_4_ = auVar12._0_4_ * fVar102;
  auVar51._4_4_ = auVar12._4_4_ * fVar213;
  auVar51._8_4_ = auVar12._8_4_ * fVar202;
  auVar51._12_4_ = auVar12._12_4_ * fVar211;
  auVar46 = vfmadd231ps_fma(auVar59,auVar48,auVar44);
  auVar47 = vfmadd231ps_fma(auVar66,auVar48,auVar55);
  auVar48 = vfmadd231ps_fma(auVar51,auVar53,auVar48);
  auVar49 = vfmadd231ps_fma(auVar46,auVar67,auVar43);
  auVar47 = vfmadd231ps_fma(auVar47,auVar67,auVar56);
  auVar50 = vfmadd231ps_fma(auVar48,auVar61,auVar67);
  auVar68._4_4_ = auVar63._0_4_;
  auVar68._0_4_ = auVar63._0_4_;
  auVar68._8_4_ = auVar63._0_4_;
  auVar68._12_4_ = auVar63._0_4_;
  auVar48 = vshufps_avx(auVar63,auVar63,0x55);
  auVar46 = vshufps_avx(auVar63,auVar63,0xaa);
  fVar102 = auVar46._0_4_;
  auVar239._0_4_ = fVar102 * auVar45._0_4_;
  fVar213 = auVar46._4_4_;
  auVar239._4_4_ = fVar213 * auVar45._4_4_;
  fVar202 = auVar46._8_4_;
  auVar239._8_4_ = fVar202 * auVar45._8_4_;
  fVar211 = auVar46._12_4_;
  auVar239._12_4_ = fVar211 * auVar45._12_4_;
  auVar69._0_4_ = auVar54._0_4_ * fVar102;
  auVar69._4_4_ = auVar54._4_4_ * fVar213;
  auVar69._8_4_ = auVar54._8_4_ * fVar202;
  auVar69._12_4_ = auVar54._12_4_ * fVar211;
  auVar62._0_4_ = auVar12._0_4_ * fVar102;
  auVar62._4_4_ = auVar12._4_4_ * fVar213;
  auVar62._8_4_ = auVar12._8_4_ * fVar202;
  auVar62._12_4_ = auVar12._12_4_ * fVar211;
  auVar44 = vfmadd231ps_fma(auVar239,auVar48,auVar44);
  auVar45 = vfmadd231ps_fma(auVar69,auVar48,auVar55);
  auVar55 = vfmadd231ps_fma(auVar62,auVar48,auVar53);
  auVar54 = vfmadd231ps_fma(auVar44,auVar68,auVar43);
  auVar53 = vfmadd231ps_fma(auVar45,auVar68,auVar56);
  auVar43 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
  auVar248 = ZEXT1664(auVar43);
  auVar12 = vfmadd231ps_fma(auVar55,auVar68,auVar61);
  auVar44 = vandps_avx512vl(auVar49,auVar43);
  auVar58._8_4_ = 0x219392ef;
  auVar58._0_8_ = 0x219392ef219392ef;
  auVar58._12_4_ = 0x219392ef;
  uVar42 = vcmpps_avx512vl(auVar44,auVar58,1);
  bVar39 = (bool)((byte)uVar42 & 1);
  auVar46._0_4_ = (uint)bVar39 * 0x219392ef | (uint)!bVar39 * auVar49._0_4_;
  bVar39 = (bool)((byte)(uVar42 >> 1) & 1);
  auVar46._4_4_ = (uint)bVar39 * 0x219392ef | (uint)!bVar39 * auVar49._4_4_;
  bVar39 = (bool)((byte)(uVar42 >> 2) & 1);
  auVar46._8_4_ = (uint)bVar39 * 0x219392ef | (uint)!bVar39 * auVar49._8_4_;
  bVar39 = (bool)((byte)(uVar42 >> 3) & 1);
  auVar46._12_4_ = (uint)bVar39 * 0x219392ef | (uint)!bVar39 * auVar49._12_4_;
  auVar44 = vandps_avx512vl(auVar47,auVar43);
  uVar42 = vcmpps_avx512vl(auVar44,auVar58,1);
  bVar39 = (bool)((byte)uVar42 & 1);
  auVar49._0_4_ = (uint)bVar39 * 0x219392ef | (uint)!bVar39 * auVar47._0_4_;
  bVar39 = (bool)((byte)(uVar42 >> 1) & 1);
  auVar49._4_4_ = (uint)bVar39 * 0x219392ef | (uint)!bVar39 * auVar47._4_4_;
  bVar39 = (bool)((byte)(uVar42 >> 2) & 1);
  auVar49._8_4_ = (uint)bVar39 * 0x219392ef | (uint)!bVar39 * auVar47._8_4_;
  bVar39 = (bool)((byte)(uVar42 >> 3) & 1);
  auVar49._12_4_ = (uint)bVar39 * 0x219392ef | (uint)!bVar39 * auVar47._12_4_;
  auVar43 = vandps_avx512vl(auVar50,auVar43);
  uVar42 = vcmpps_avx512vl(auVar43,auVar58,1);
  bVar39 = (bool)((byte)uVar42 & 1);
  auVar47._0_4_ = (uint)bVar39 * 0x219392ef | (uint)!bVar39 * auVar50._0_4_;
  bVar39 = (bool)((byte)(uVar42 >> 1) & 1);
  auVar47._4_4_ = (uint)bVar39 * 0x219392ef | (uint)!bVar39 * auVar50._4_4_;
  bVar39 = (bool)((byte)(uVar42 >> 2) & 1);
  auVar47._8_4_ = (uint)bVar39 * 0x219392ef | (uint)!bVar39 * auVar50._8_4_;
  bVar39 = (bool)((byte)(uVar42 >> 3) & 1);
  auVar47._12_4_ = (uint)bVar39 * 0x219392ef | (uint)!bVar39 * auVar50._12_4_;
  auVar43 = vrcp14ps_avx512vl(auVar46);
  auVar44 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
  auVar249 = ZEXT1664(auVar44);
  auVar45 = vfnmadd213ps_avx512vl(auVar46,auVar43,auVar44);
  auVar56 = vfmadd132ps_fma(auVar45,auVar43,auVar43);
  auVar43 = vrcp14ps_avx512vl(auVar49);
  auVar45 = vfnmadd213ps_avx512vl(auVar49,auVar43,auVar44);
  auVar55 = vfmadd132ps_fma(auVar45,auVar43,auVar43);
  auVar43 = vrcp14ps_avx512vl(auVar47);
  auVar44 = vfnmadd213ps_avx512vl(auVar47,auVar43,auVar44);
  auVar61 = vfmadd132ps_fma(auVar44,auVar43,auVar43);
  auVar43._8_8_ = 0;
  auVar43._0_8_ = *(ulong *)(prim + uVar35 * 7 + 6);
  auVar43 = vpmovsxwd_avx(auVar43);
  auVar43 = vcvtdq2ps_avx(auVar43);
  auVar43 = vsubps_avx(auVar43,auVar54);
  auVar57._0_4_ = auVar56._0_4_ * auVar43._0_4_;
  auVar57._4_4_ = auVar56._4_4_ * auVar43._4_4_;
  auVar57._8_4_ = auVar56._8_4_ * auVar43._8_4_;
  auVar57._12_4_ = auVar56._12_4_ * auVar43._12_4_;
  auVar44._8_8_ = 0;
  auVar44._0_8_ = *(ulong *)(prim + uVar35 * 9 + 6);
  auVar43 = vpmovsxwd_avx(auVar44);
  auVar43 = vcvtdq2ps_avx(auVar43);
  auVar43 = vsubps_avx(auVar43,auVar54);
  auVar46 = vpbroadcastd_avx512vl();
  auVar45._8_8_ = 0;
  auVar45._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar3 * 0x10 + 6);
  auVar44 = vpmovsxwd_avx(auVar45);
  auVar60._0_4_ = auVar56._0_4_ * auVar43._0_4_;
  auVar60._4_4_ = auVar56._4_4_ * auVar43._4_4_;
  auVar60._8_4_ = auVar56._8_4_ * auVar43._8_4_;
  auVar60._12_4_ = auVar56._12_4_ * auVar43._12_4_;
  auVar56._8_8_ = 0;
  auVar56._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar3 * 0x10 + uVar35 * -2 + 6);
  auVar43 = vpmovsxwd_avx(auVar56);
  auVar43 = vcvtdq2ps_avx(auVar43);
  auVar43 = vsubps_avx(auVar43,auVar53);
  auVar65._0_4_ = auVar55._0_4_ * auVar43._0_4_;
  auVar65._4_4_ = auVar55._4_4_ * auVar43._4_4_;
  auVar65._8_4_ = auVar55._8_4_ * auVar43._8_4_;
  auVar65._12_4_ = auVar55._12_4_ * auVar43._12_4_;
  auVar43 = vcvtdq2ps_avx(auVar44);
  auVar43 = vsubps_avx(auVar43,auVar53);
  auVar64._0_4_ = auVar55._0_4_ * auVar43._0_4_;
  auVar64._4_4_ = auVar55._4_4_ * auVar43._4_4_;
  auVar64._8_4_ = auVar55._8_4_ * auVar43._8_4_;
  auVar64._12_4_ = auVar55._12_4_ * auVar43._12_4_;
  auVar55._8_8_ = 0;
  auVar55._0_8_ = *(ulong *)(prim + uVar30 + uVar35 + 6);
  auVar43 = vpmovsxwd_avx(auVar55);
  auVar43 = vcvtdq2ps_avx(auVar43);
  auVar43 = vsubps_avx(auVar43,auVar12);
  auVar139._0_4_ = auVar61._0_4_ * auVar43._0_4_;
  auVar139._4_4_ = auVar61._4_4_ * auVar43._4_4_;
  auVar139._8_4_ = auVar61._8_4_ * auVar43._8_4_;
  auVar139._12_4_ = auVar61._12_4_ * auVar43._12_4_;
  auVar54._8_8_ = 0;
  auVar54._0_8_ = *(ulong *)(prim + uVar35 * 0x17 + 6);
  auVar43 = vpmovsxwd_avx(auVar54);
  auVar43 = vcvtdq2ps_avx(auVar43);
  auVar43 = vsubps_avx(auVar43,auVar12);
  auVar52._0_4_ = auVar61._0_4_ * auVar43._0_4_;
  auVar52._4_4_ = auVar61._4_4_ * auVar43._4_4_;
  auVar52._8_4_ = auVar61._8_4_ * auVar43._8_4_;
  auVar52._12_4_ = auVar61._12_4_ * auVar43._12_4_;
  auVar43 = vpminsd_avx(auVar57,auVar60);
  auVar44 = vpminsd_avx(auVar65,auVar64);
  auVar43 = vmaxps_avx(auVar43,auVar44);
  auVar44 = vpminsd_avx(auVar139,auVar52);
  uVar109 = *(undefined4 *)(ray + k * 4 + 0x60);
  auVar61._4_4_ = uVar109;
  auVar61._0_4_ = uVar109;
  auVar61._8_4_ = uVar109;
  auVar61._12_4_ = uVar109;
  auVar44 = vmaxps_avx512vl(auVar44,auVar61);
  auVar43 = vmaxps_avx(auVar43,auVar44);
  auVar53._8_4_ = 0x3f7ffffa;
  auVar53._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar53._12_4_ = 0x3f7ffffa;
  local_400 = vmulps_avx512vl(auVar43,auVar53);
  auVar43 = vpmaxsd_avx(auVar57,auVar60);
  auVar44 = vpmaxsd_avx(auVar65,auVar64);
  auVar43 = vminps_avx(auVar43,auVar44);
  auVar44 = vpmaxsd_avx(auVar139,auVar52);
  uVar109 = *(undefined4 *)(ray + k * 4 + 0x100);
  auVar12._4_4_ = uVar109;
  auVar12._0_4_ = uVar109;
  auVar12._8_4_ = uVar109;
  auVar12._12_4_ = uVar109;
  auVar44 = vminps_avx512vl(auVar44,auVar12);
  auVar43 = vminps_avx(auVar43,auVar44);
  auVar48._8_4_ = 0x3f800003;
  auVar48._0_8_ = 0x3f8000033f800003;
  auVar48._12_4_ = 0x3f800003;
  auVar43 = vmulps_avx512vl(auVar43,auVar48);
  uVar13 = vcmpps_avx512vl(local_400,auVar43,2);
  uVar42 = vpcmpgtd_avx512vl(auVar46,_DAT_01f7fcf0);
  uVar42 = ((byte)uVar13 & 0xf) & uVar42;
  if ((char)uVar42 == '\0') {
    return;
  }
  local_240 = vpmovm2d_avx512vl((ulong)(uint)(1 << ((uint)k & 0x1f)));
  auVar43 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
  auVar252 = ZEXT1664(auVar43);
  auVar43 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
  auVar244 = ZEXT1664(auVar43);
  auVar251 = ZEXT464(0x3f800000);
  auVar43 = vxorps_avx512vl(in_ZMM29._0_16_,in_ZMM29._0_16_);
  auVar250 = ZEXT1664(auVar43);
LAB_01ae4273:
  lVar32 = 0;
  for (uVar30 = uVar42; (uVar30 & 1) == 0; uVar30 = uVar30 >> 1 | 0x8000000000000000) {
    lVar32 = lVar32 + 1;
  }
  uVar36 = *(uint *)(prim + 2);
  uVar4 = *(uint *)(prim + lVar32 * 4 + 6);
  pGVar6 = (context->scene->geometries).items[uVar36].ptr;
  uVar30 = (ulong)*(uint *)(*(long *)&pGVar6->field_0x58 +
                           pGVar6[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i * (ulong)uVar4);
  p_Var7 = pGVar6[1].intersectionFilterN;
  pvVar8 = pGVar6[2].userPtr;
  _Var9 = pGVar6[2].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  auVar43 = *(undefined1 (*) [16])(_Var9 + uVar30 * (long)pvVar8);
  auVar44 = *(undefined1 (*) [16])(_Var9 + (uVar30 + 1) * (long)pvVar8);
  auVar45 = *(undefined1 (*) [16])(_Var9 + (uVar30 + 2) * (long)pvVar8);
  auVar56 = *(undefined1 (*) [16])(_Var9 + (long)pvVar8 * (uVar30 + 3));
  lVar32 = *(long *)&pGVar6[1].time_range.upper;
  auVar55 = *(undefined1 (*) [16])(lVar32 + (long)p_Var7 * uVar30);
  auVar54 = *(undefined1 (*) [16])(lVar32 + (long)p_Var7 * (uVar30 + 1));
  auVar61 = *(undefined1 (*) [16])(lVar32 + (long)p_Var7 * (uVar30 + 2));
  uVar42 = uVar42 - 1 & uVar42;
  auVar53 = *(undefined1 (*) [16])(lVar32 + (long)p_Var7 * (uVar30 + 3));
  if (uVar42 != 0) {
    uVar35 = uVar42 - 1 & uVar42;
    for (uVar30 = uVar42; (uVar30 & 1) == 0; uVar30 = uVar30 >> 1 | 0x8000000000000000) {
    }
    if (uVar35 != 0) {
      for (; (uVar35 & 1) == 0; uVar35 = uVar35 >> 1 | 0x8000000000000000) {
      }
    }
  }
  auVar12 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                          0x1c);
  auVar12 = vinsertps_avx(auVar12,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x28);
  fVar102 = *(float *)(ray + k * 4 + 0x60);
  auVar59 = auVar252._0_16_;
  auVar46 = vmulps_avx512vl(auVar53,auVar59);
  auVar110._0_12_ = ZEXT812(0);
  auVar110._12_4_ = 0;
  auVar48 = vfmadd213ps_fma(auVar110,auVar61,auVar46);
  auVar111._0_4_ = auVar54._0_4_ + auVar48._0_4_;
  auVar111._4_4_ = auVar54._4_4_ + auVar48._4_4_;
  auVar111._8_4_ = auVar54._8_4_ + auVar48._8_4_;
  auVar111._12_4_ = auVar54._12_4_ + auVar48._12_4_;
  auVar47 = vfmadd231ps_avx512vl(auVar111,auVar55,auVar59);
  auVar66 = ZEXT816(0) << 0x40;
  auVar118._0_4_ = auVar53._0_4_ * 0.0;
  auVar118._4_4_ = auVar53._4_4_ * 0.0;
  auVar118._8_4_ = auVar53._8_4_ * 0.0;
  auVar118._12_4_ = auVar53._12_4_ * 0.0;
  auVar64 = auVar244._0_16_;
  auVar48 = vfmadd231ps_avx512vl(auVar118,auVar61,auVar64);
  auVar48 = vfmadd231ps_fma(auVar48,auVar54,auVar66);
  auVar49 = vfnmadd231ps_avx512vl(auVar48,auVar55,auVar64);
  auVar50 = vmulps_avx512vl(auVar56,auVar59);
  auVar48 = vfmadd213ps_fma(ZEXT816(0) << 0x40,auVar45,auVar50);
  auVar228._0_4_ = auVar48._0_4_ + auVar44._0_4_;
  auVar228._4_4_ = auVar48._4_4_ + auVar44._4_4_;
  auVar228._8_4_ = auVar48._8_4_ + auVar44._8_4_;
  auVar228._12_4_ = auVar48._12_4_ + auVar44._12_4_;
  auVar51 = vfmadd231ps_avx512vl(auVar228,auVar43,auVar59);
  auVar235._0_4_ = auVar56._0_4_ * 0.0;
  auVar235._4_4_ = auVar56._4_4_ * 0.0;
  auVar235._8_4_ = auVar56._8_4_ * 0.0;
  auVar235._12_4_ = auVar56._12_4_ * 0.0;
  auVar48 = vfmadd231ps_avx512vl(auVar235,auVar45,auVar64);
  auVar48 = vfmadd231ps_fma(auVar48,auVar44,auVar66);
  auVar52 = vfnmadd231ps_avx512vl(auVar48,auVar43,auVar64);
  auVar128._0_4_ = auVar61._0_4_ + auVar46._0_4_;
  auVar128._4_4_ = auVar61._4_4_ + auVar46._4_4_;
  auVar128._8_4_ = auVar61._8_4_ + auVar46._8_4_;
  auVar128._12_4_ = auVar61._12_4_ + auVar46._12_4_;
  auVar48 = vfmadd231ps_fma(auVar128,auVar54,auVar66);
  auVar48 = vfmadd231ps_avx512vl(auVar48,auVar55,auVar59);
  auVar53 = vmulps_avx512vl(auVar53,auVar64);
  auVar61 = vfmadd231ps_fma(auVar53,auVar66,auVar61);
  auVar54 = vfnmadd231ps_avx512vl(auVar61,auVar64,auVar54);
  auVar61 = vfmadd231ps_fma(auVar54,auVar66,auVar55);
  auVar186._0_4_ = auVar50._0_4_ + auVar45._0_4_;
  auVar186._4_4_ = auVar50._4_4_ + auVar45._4_4_;
  auVar186._8_4_ = auVar50._8_4_ + auVar45._8_4_;
  auVar186._12_4_ = auVar50._12_4_ + auVar45._12_4_;
  auVar55 = vfmadd231ps_fma(auVar186,auVar44,auVar66);
  auVar55 = vfmadd231ps_avx512vl(auVar55,auVar43,auVar59);
  auVar56 = vmulps_avx512vl(auVar56,auVar64);
  auVar45 = vfmadd231ps_fma(auVar56,auVar66,auVar45);
  auVar44 = vfnmadd231ps_avx512vl(auVar45,auVar64,auVar44);
  auVar54 = vfmadd231ps_fma(auVar44,auVar66,auVar43);
  auVar43 = vshufps_avx(auVar49,auVar49,0xc9);
  auVar44 = vshufps_avx(auVar51,auVar51,0xc9);
  fVar117 = auVar49._0_4_;
  auVar156._0_4_ = fVar117 * auVar44._0_4_;
  fVar125 = auVar49._4_4_;
  auVar156._4_4_ = fVar125 * auVar44._4_4_;
  fVar126 = auVar49._8_4_;
  auVar156._8_4_ = fVar126 * auVar44._8_4_;
  fVar127 = auVar49._12_4_;
  auVar156._12_4_ = fVar127 * auVar44._12_4_;
  auVar44 = vfmsub231ps_fma(auVar156,auVar43,auVar51);
  auVar45 = vshufps_avx(auVar44,auVar44,0xc9);
  auVar44 = vshufps_avx(auVar52,auVar52,0xc9);
  auVar157._0_4_ = fVar117 * auVar44._0_4_;
  auVar157._4_4_ = fVar125 * auVar44._4_4_;
  auVar157._8_4_ = fVar126 * auVar44._8_4_;
  auVar157._12_4_ = fVar127 * auVar44._12_4_;
  auVar43 = vfmsub231ps_fma(auVar157,auVar43,auVar52);
  auVar56 = vshufps_avx(auVar43,auVar43,0xc9);
  auVar43 = vshufps_avx(auVar61,auVar61,0xc9);
  auVar44 = vshufps_avx(auVar55,auVar55,0xc9);
  fVar138 = auVar61._0_4_;
  auVar147._0_4_ = fVar138 * auVar44._0_4_;
  fVar144 = auVar61._4_4_;
  auVar147._4_4_ = fVar144 * auVar44._4_4_;
  fVar145 = auVar61._8_4_;
  auVar147._8_4_ = fVar145 * auVar44._8_4_;
  fVar146 = auVar61._12_4_;
  auVar147._12_4_ = fVar146 * auVar44._12_4_;
  auVar44 = vfmsub231ps_fma(auVar147,auVar43,auVar55);
  auVar55 = vshufps_avx(auVar44,auVar44,0xc9);
  auVar44 = vshufps_avx(auVar54,auVar54,0xc9);
  auVar187._0_4_ = auVar44._0_4_ * fVar138;
  auVar187._4_4_ = auVar44._4_4_ * fVar144;
  auVar187._8_4_ = auVar44._8_4_ * fVar145;
  auVar187._12_4_ = auVar44._12_4_ * fVar146;
  auVar44 = vfmsub231ps_fma(auVar187,auVar43,auVar54);
  auVar43 = vdpps_avx(auVar45,auVar45,0x7f);
  auVar54 = vshufps_avx(auVar44,auVar44,0xc9);
  fVar202 = auVar43._0_4_;
  auVar188._4_12_ = ZEXT812(0) << 0x20;
  auVar188._0_4_ = fVar202;
  auVar44 = vrsqrt14ss_avx512f(auVar66,auVar188);
  auVar53 = vmulss_avx512f(auVar44,ZEXT416(0x3fc00000));
  auVar46 = vmulss_avx512f(auVar43,ZEXT416(0xbf000000));
  fVar213 = auVar44._0_4_;
  auVar44 = vdpps_avx(auVar45,auVar56,0x7f);
  fVar213 = auVar53._0_4_ + auVar46._0_4_ * fVar213 * fVar213 * fVar213;
  fVar214 = fVar213 * auVar45._0_4_;
  fVar224 = fVar213 * auVar45._4_4_;
  fVar225 = fVar213 * auVar45._8_4_;
  fVar226 = fVar213 * auVar45._12_4_;
  auVar197._0_4_ = auVar56._0_4_ * fVar202;
  auVar197._4_4_ = auVar56._4_4_ * fVar202;
  auVar197._8_4_ = auVar56._8_4_ * fVar202;
  auVar197._12_4_ = auVar56._12_4_ * fVar202;
  fVar202 = auVar44._0_4_;
  auVar168._0_4_ = fVar202 * auVar45._0_4_;
  auVar168._4_4_ = fVar202 * auVar45._4_4_;
  auVar168._8_4_ = fVar202 * auVar45._8_4_;
  auVar168._12_4_ = fVar202 * auVar45._12_4_;
  auVar45 = vsubps_avx(auVar197,auVar168);
  auVar44 = vrcp14ss_avx512f(auVar66,auVar188);
  auVar43 = vfnmadd213ss_avx512f(auVar43,auVar44,ZEXT416(0x40000000));
  fVar211 = auVar44._0_4_ * auVar43._0_4_;
  auVar43 = vdpps_avx(auVar55,auVar55,0x7f);
  fVar212 = auVar43._0_4_;
  auVar189._4_12_ = ZEXT812(0) << 0x20;
  auVar189._0_4_ = fVar212;
  auVar44 = vrsqrt14ss_avx512f(auVar66,auVar189);
  auVar56 = vmulss_avx512f(auVar44,ZEXT416(0x3fc00000));
  auVar53 = vmulss_avx512f(auVar43,ZEXT416(0xbf000000));
  fVar202 = auVar44._0_4_;
  fVar202 = auVar56._0_4_ + auVar53._0_4_ * fVar202 * fVar202 * fVar202;
  auVar44 = vdpps_avx(auVar55,auVar54,0x7f);
  fVar227 = fVar202 * auVar55._0_4_;
  fVar232 = fVar202 * auVar55._4_4_;
  fVar233 = fVar202 * auVar55._8_4_;
  fVar234 = fVar202 * auVar55._12_4_;
  auVar158._0_4_ = fVar212 * auVar54._0_4_;
  auVar158._4_4_ = fVar212 * auVar54._4_4_;
  auVar158._8_4_ = fVar212 * auVar54._8_4_;
  auVar158._12_4_ = fVar212 * auVar54._12_4_;
  fVar212 = auVar44._0_4_;
  auVar148._0_4_ = fVar212 * auVar55._0_4_;
  auVar148._4_4_ = fVar212 * auVar55._4_4_;
  auVar148._8_4_ = fVar212 * auVar55._8_4_;
  auVar148._12_4_ = fVar212 * auVar55._12_4_;
  auVar56 = vsubps_avx(auVar158,auVar148);
  auVar44 = vrcp14ss_avx512f(auVar66,auVar189);
  auVar43 = vfnmadd213ss_avx512f(auVar43,auVar44,ZEXT416(0x40000000));
  fVar212 = auVar43._0_4_ * auVar44._0_4_;
  auVar43 = vshufps_avx(auVar47,auVar47,0xff);
  auVar174._0_4_ = fVar214 * auVar43._0_4_;
  auVar174._4_4_ = fVar224 * auVar43._4_4_;
  auVar174._8_4_ = fVar225 * auVar43._8_4_;
  auVar174._12_4_ = fVar226 * auVar43._12_4_;
  local_340 = vsubps_avx(auVar47,auVar174);
  auVar44 = vshufps_avx(auVar49,auVar49,0xff);
  auVar159._0_4_ = auVar44._0_4_ * fVar214 + auVar43._0_4_ * fVar213 * fVar211 * auVar45._0_4_;
  auVar159._4_4_ = auVar44._4_4_ * fVar224 + auVar43._4_4_ * fVar213 * fVar211 * auVar45._4_4_;
  auVar159._8_4_ = auVar44._8_4_ * fVar225 + auVar43._8_4_ * fVar213 * fVar211 * auVar45._8_4_;
  auVar159._12_4_ = auVar44._12_4_ * fVar226 + auVar43._12_4_ * fVar213 * fVar211 * auVar45._12_4_;
  auVar45 = vsubps_avx(auVar49,auVar159);
  local_350._0_4_ = auVar174._0_4_ + auVar47._0_4_;
  local_350._4_4_ = auVar174._4_4_ + auVar47._4_4_;
  fStack_348 = auVar174._8_4_ + auVar47._8_4_;
  fStack_344 = auVar174._12_4_ + auVar47._12_4_;
  auVar43 = vshufps_avx(auVar48,auVar48,0xff);
  auVar160._0_4_ = fVar227 * auVar43._0_4_;
  auVar160._4_4_ = fVar232 * auVar43._4_4_;
  auVar160._8_4_ = fVar233 * auVar43._8_4_;
  auVar160._12_4_ = fVar234 * auVar43._12_4_;
  local_360 = vsubps_avx512vl(auVar48,auVar160);
  auVar44 = vshufps_avx(auVar61,auVar61,0xff);
  auVar119._0_4_ = auVar44._0_4_ * fVar227 + auVar43._0_4_ * fVar202 * auVar56._0_4_ * fVar212;
  auVar119._4_4_ = auVar44._4_4_ * fVar232 + auVar43._4_4_ * fVar202 * auVar56._4_4_ * fVar212;
  auVar119._8_4_ = auVar44._8_4_ * fVar233 + auVar43._8_4_ * fVar202 * auVar56._8_4_ * fVar212;
  auVar119._12_4_ = auVar44._12_4_ * fVar234 + auVar43._12_4_ * fVar202 * auVar56._12_4_ * fVar212;
  auVar43 = vsubps_avx(auVar61,auVar119);
  local_370._0_4_ = auVar48._0_4_ + auVar160._0_4_;
  local_370._4_4_ = auVar48._4_4_ + auVar160._4_4_;
  fStack_368 = auVar48._8_4_ + auVar160._8_4_;
  fStack_364 = auVar48._12_4_ + auVar160._12_4_;
  auVar129._0_4_ = auVar45._0_4_ * 0.33333334;
  auVar129._4_4_ = auVar45._4_4_ * 0.33333334;
  auVar129._8_4_ = auVar45._8_4_ * 0.33333334;
  auVar129._12_4_ = auVar45._12_4_ * 0.33333334;
  local_380 = vaddps_avx512vl(local_340,auVar129);
  auVar130._0_4_ = auVar43._0_4_ * 0.33333334;
  auVar130._4_4_ = auVar43._4_4_ * 0.33333334;
  auVar130._8_4_ = auVar43._8_4_ * 0.33333334;
  auVar130._12_4_ = auVar43._12_4_ * 0.33333334;
  local_390 = vsubps_avx512vl(local_360,auVar130);
  auVar112._0_4_ = (fVar117 + auVar159._0_4_) * 0.33333334;
  auVar112._4_4_ = (fVar125 + auVar159._4_4_) * 0.33333334;
  auVar112._8_4_ = (fVar126 + auVar159._8_4_) * 0.33333334;
  auVar112._12_4_ = (fVar127 + auVar159._12_4_) * 0.33333334;
  _local_3a0 = vaddps_avx512vl(_local_350,auVar112);
  auVar113._0_4_ = (fVar138 + auVar119._0_4_) * 0.33333334;
  auVar113._4_4_ = (fVar144 + auVar119._4_4_) * 0.33333334;
  auVar113._8_4_ = (fVar145 + auVar119._8_4_) * 0.33333334;
  auVar113._12_4_ = (fVar146 + auVar119._12_4_) * 0.33333334;
  _local_3b0 = vsubps_avx512vl(_local_370,auVar113);
  local_2c0 = vsubps_avx(local_340,auVar12);
  uVar109 = local_2c0._0_4_;
  auVar120._4_4_ = uVar109;
  auVar120._0_4_ = uVar109;
  auVar120._8_4_ = uVar109;
  auVar120._12_4_ = uVar109;
  auVar43 = vshufps_avx(local_2c0,local_2c0,0x55);
  aVar1 = pre->ray_space[k].vx.field_0;
  aVar2 = pre->ray_space[k].vy.field_0;
  auVar44 = vshufps_avx(local_2c0,local_2c0,0xaa);
  fVar213 = pre->ray_space[k].vz.field_0.m128[0];
  fVar202 = pre->ray_space[k].vz.field_0.m128[1];
  fVar211 = pre->ray_space[k].vz.field_0.m128[2];
  fVar212 = pre->ray_space[k].vz.field_0.m128[3];
  auVar114._0_4_ = fVar213 * auVar44._0_4_;
  auVar114._4_4_ = fVar202 * auVar44._4_4_;
  auVar114._8_4_ = fVar211 * auVar44._8_4_;
  auVar114._12_4_ = fVar212 * auVar44._12_4_;
  auVar43 = vfmadd231ps_fma(auVar114,(undefined1  [16])aVar2,auVar43);
  auVar55 = vfmadd231ps_fma(auVar43,(undefined1  [16])aVar1,auVar120);
  local_2d0 = vsubps_avx512vl(local_380,auVar12);
  uVar109 = local_2d0._0_4_;
  auVar131._4_4_ = uVar109;
  auVar131._0_4_ = uVar109;
  auVar131._8_4_ = uVar109;
  auVar131._12_4_ = uVar109;
  auVar43 = vshufps_avx(local_2d0,local_2d0,0x55);
  auVar44 = vshufps_avx(local_2d0,local_2d0,0xaa);
  auVar121._0_4_ = fVar213 * auVar44._0_4_;
  auVar121._4_4_ = fVar202 * auVar44._4_4_;
  auVar121._8_4_ = fVar211 * auVar44._8_4_;
  auVar121._12_4_ = fVar212 * auVar44._12_4_;
  auVar43 = vfmadd231ps_fma(auVar121,(undefined1  [16])aVar2,auVar43);
  auVar54 = vfmadd231ps_fma(auVar43,(undefined1  [16])aVar1,auVar131);
  local_2e0 = vsubps_avx512vl(local_390,auVar12);
  uVar109 = local_2e0._0_4_;
  auVar161._4_4_ = uVar109;
  auVar161._0_4_ = uVar109;
  auVar161._8_4_ = uVar109;
  auVar161._12_4_ = uVar109;
  auVar43 = vshufps_avx(local_2e0,local_2e0,0x55);
  auVar44 = vshufps_avx(local_2e0,local_2e0,0xaa);
  auVar132._0_4_ = fVar213 * auVar44._0_4_;
  auVar132._4_4_ = fVar202 * auVar44._4_4_;
  auVar132._8_4_ = fVar211 * auVar44._8_4_;
  auVar132._12_4_ = fVar212 * auVar44._12_4_;
  auVar43 = vfmadd231ps_fma(auVar132,(undefined1  [16])aVar2,auVar43);
  auVar61 = vfmadd231ps_fma(auVar43,(undefined1  [16])aVar1,auVar161);
  local_2f0 = vsubps_avx512vl(local_360,auVar12);
  uVar109 = local_2f0._0_4_;
  auVar175._4_4_ = uVar109;
  auVar175._0_4_ = uVar109;
  auVar175._8_4_ = uVar109;
  auVar175._12_4_ = uVar109;
  auVar43 = vshufps_avx(local_2f0,local_2f0,0x55);
  auVar44 = vshufps_avx(local_2f0,local_2f0,0xaa);
  auVar162._0_4_ = fVar213 * auVar44._0_4_;
  auVar162._4_4_ = fVar202 * auVar44._4_4_;
  auVar162._8_4_ = fVar211 * auVar44._8_4_;
  auVar162._12_4_ = fVar212 * auVar44._12_4_;
  auVar43 = vfmadd231ps_fma(auVar162,(undefined1  [16])aVar2,auVar43);
  auVar53 = vfmadd231ps_fma(auVar43,(undefined1  [16])aVar1,auVar175);
  local_300 = vsubps_avx(_local_350,auVar12);
  uVar109 = local_300._0_4_;
  auVar176._4_4_ = uVar109;
  auVar176._0_4_ = uVar109;
  auVar176._8_4_ = uVar109;
  auVar176._12_4_ = uVar109;
  auVar43 = vshufps_avx(local_300,local_300,0x55);
  auVar44 = vshufps_avx(local_300,local_300,0xaa);
  auVar198._0_4_ = auVar44._0_4_ * fVar213;
  auVar198._4_4_ = auVar44._4_4_ * fVar202;
  auVar198._8_4_ = auVar44._8_4_ * fVar211;
  auVar198._12_4_ = auVar44._12_4_ * fVar212;
  auVar43 = vfmadd231ps_fma(auVar198,(undefined1  [16])aVar2,auVar43);
  auVar48 = vfmadd231ps_fma(auVar43,(undefined1  [16])aVar1,auVar176);
  local_310 = vsubps_avx512vl(_local_3a0,auVar12);
  uVar109 = local_310._0_4_;
  auVar177._4_4_ = uVar109;
  auVar177._0_4_ = uVar109;
  auVar177._8_4_ = uVar109;
  auVar177._12_4_ = uVar109;
  auVar43 = vshufps_avx(local_310,local_310,0x55);
  auVar44 = vshufps_avx(local_310,local_310,0xaa);
  auVar203._0_4_ = auVar44._0_4_ * fVar213;
  auVar203._4_4_ = auVar44._4_4_ * fVar202;
  auVar203._8_4_ = auVar44._8_4_ * fVar211;
  auVar203._12_4_ = auVar44._12_4_ * fVar212;
  auVar43 = vfmadd231ps_fma(auVar203,(undefined1  [16])aVar2,auVar43);
  auVar46 = vfmadd231ps_fma(auVar43,(undefined1  [16])aVar1,auVar177);
  local_320 = vsubps_avx512vl(_local_3b0,auVar12);
  uVar109 = local_320._0_4_;
  auVar178._4_4_ = uVar109;
  auVar178._0_4_ = uVar109;
  auVar178._8_4_ = uVar109;
  auVar178._12_4_ = uVar109;
  auVar43 = vshufps_avx(local_320,local_320,0x55);
  auVar44 = vshufps_avx(local_320,local_320,0xaa);
  auVar215._0_4_ = auVar44._0_4_ * fVar213;
  auVar215._4_4_ = auVar44._4_4_ * fVar202;
  auVar215._8_4_ = auVar44._8_4_ * fVar211;
  auVar215._12_4_ = auVar44._12_4_ * fVar212;
  auVar43 = vfmadd231ps_fma(auVar215,(undefined1  [16])aVar2,auVar43);
  auVar47 = vfmadd231ps_fma(auVar43,(undefined1  [16])aVar1,auVar178);
  local_330 = vsubps_avx(_local_370,auVar12);
  uVar109 = local_330._0_4_;
  auVar103._4_4_ = uVar109;
  auVar103._0_4_ = uVar109;
  auVar103._8_4_ = uVar109;
  auVar103._12_4_ = uVar109;
  auVar43 = vshufps_avx(local_330,local_330,0x55);
  auVar44 = vshufps_avx(local_330,local_330,0xaa);
  auVar169._0_4_ = auVar44._0_4_ * fVar213;
  auVar169._4_4_ = auVar44._4_4_ * fVar202;
  auVar169._8_4_ = auVar44._8_4_ * fVar211;
  auVar169._12_4_ = auVar44._12_4_ * fVar212;
  auVar43 = vfmadd231ps_fma(auVar169,(undefined1  [16])aVar2,auVar43);
  auVar12 = vfmadd231ps_fma(auVar43,(undefined1  [16])aVar1,auVar103);
  auVar45 = vmovlhps_avx(auVar55,auVar48);
  local_440 = vmovlhps_avx(auVar54,auVar46);
  local_450 = vmovlhps_avx512f(auVar61,auVar47);
  _local_270 = vmovlhps_avx512f(auVar53,auVar12);
  auVar44 = vminps_avx(auVar45,local_440);
  auVar43 = vmaxps_avx(auVar45,local_440);
  auVar56 = vminps_avx512vl(local_450,_local_270);
  auVar44 = vminps_avx(auVar44,auVar56);
  auVar56 = vmaxps_avx512vl(local_450,_local_270);
  auVar43 = vmaxps_avx(auVar43,auVar56);
  auVar56 = vshufpd_avx(auVar44,auVar44,3);
  auVar44 = vminps_avx(auVar44,auVar56);
  auVar56 = vshufpd_avx(auVar43,auVar43,3);
  auVar43 = vmaxps_avx(auVar43,auVar56);
  auVar44 = vandps_avx512vl(auVar44,auVar248._0_16_);
  auVar43 = vandps_avx512vl(auVar43,auVar248._0_16_);
  auVar43 = vmaxps_avx(auVar44,auVar43);
  auVar44 = vmovshdup_avx(auVar43);
  auVar43 = vmaxss_avx(auVar44,auVar43);
  fVar213 = auVar43._0_4_ * 9.536743e-07;
  auVar44 = vmovddup_avx512vl(auVar55);
  auVar56 = vmovddup_avx512vl(auVar54);
  auVar55 = vmovddup_avx512vl(auVar61);
  auVar54 = vmovddup_avx512vl(auVar53);
  local_280 = ZEXT416((uint)fVar213);
  auVar104._4_4_ = fVar213;
  auVar104._0_4_ = fVar213;
  auVar104._8_4_ = fVar213;
  auVar104._12_4_ = fVar213;
  local_1c0._16_4_ = fVar213;
  local_1c0._0_16_ = auVar104;
  local_1c0._20_4_ = fVar213;
  local_1c0._24_4_ = fVar213;
  local_1c0._28_4_ = fVar213;
  auVar43 = vxorps_avx512vl(auVar104,auVar59);
  local_1e0 = auVar43._0_4_;
  uStack_1dc = local_1e0;
  uStack_1d8 = local_1e0;
  uStack_1d4 = local_1e0;
  uStack_1d0 = local_1e0;
  uStack_1cc = local_1e0;
  uStack_1c8 = local_1e0;
  uStack_1c4 = local_1e0;
  uVar30 = 0;
  local_290 = vsubps_avx(local_440,auVar45);
  local_2a0 = vsubps_avx512vl(local_450,local_440);
  local_2b0 = vsubps_avx512vl(_local_270,local_450);
  local_3c0 = vsubps_avx(_local_350,local_340);
  local_3d0 = vsubps_avx512vl(_local_3a0,local_380);
  local_3e0 = vsubps_avx512vl(_local_3b0,local_390);
  _local_3f0 = vsubps_avx512vl(_local_370,local_360);
  local_200 = vpbroadcastd_avx512vl();
  local_220 = vpbroadcastd_avx512vl();
  auVar43 = ZEXT816(0x3f80000000000000);
  auVar115 = auVar43;
LAB_01ae49cb:
  do {
    auVar61 = vshufps_avx(auVar115,auVar115,0x50);
    auVar236._8_4_ = 0x3f800000;
    auVar236._0_8_ = 0x3f8000003f800000;
    auVar236._12_4_ = 0x3f800000;
    auVar90._16_4_ = 0x3f800000;
    auVar90._0_16_ = auVar236;
    auVar90._20_4_ = 0x3f800000;
    auVar90._24_4_ = 0x3f800000;
    auVar90._28_4_ = 0x3f800000;
    auVar53 = vsubps_avx(auVar236,auVar61);
    fVar213 = auVar61._0_4_;
    fVar117 = auVar48._0_4_;
    auVar140._0_4_ = fVar117 * fVar213;
    fVar202 = auVar61._4_4_;
    fVar125 = auVar48._4_4_;
    auVar140._4_4_ = fVar125 * fVar202;
    fVar211 = auVar61._8_4_;
    auVar140._8_4_ = fVar117 * fVar211;
    fVar212 = auVar61._12_4_;
    auVar140._12_4_ = fVar125 * fVar212;
    fVar126 = auVar46._0_4_;
    auVar149._0_4_ = fVar126 * fVar213;
    fVar127 = auVar46._4_4_;
    auVar149._4_4_ = fVar127 * fVar202;
    auVar149._8_4_ = fVar126 * fVar211;
    auVar149._12_4_ = fVar127 * fVar212;
    fVar138 = auVar47._0_4_;
    auVar163._0_4_ = fVar138 * fVar213;
    fVar144 = auVar47._4_4_;
    auVar163._4_4_ = fVar144 * fVar202;
    auVar163._8_4_ = fVar138 * fVar211;
    auVar163._12_4_ = fVar144 * fVar212;
    fVar145 = auVar12._0_4_;
    auVar122._0_4_ = fVar145 * fVar213;
    fVar146 = auVar12._4_4_;
    auVar122._4_4_ = fVar146 * fVar202;
    auVar122._8_4_ = fVar145 * fVar211;
    auVar122._12_4_ = fVar146 * fVar212;
    auVar49 = vfmadd231ps_avx512vl(auVar140,auVar53,auVar44);
    auVar50 = vfmadd231ps_avx512vl(auVar149,auVar53,auVar56);
    auVar51 = vfmadd231ps_avx512vl(auVar163,auVar53,auVar55);
    auVar53 = vfmadd231ps_avx512vl(auVar122,auVar54,auVar53);
    auVar61 = vmovshdup_avx(auVar43);
    fVar202 = auVar43._0_4_;
    fVar213 = (auVar61._0_4_ - fVar202) * 0.04761905;
    auVar84._4_4_ = fVar202;
    auVar84._0_4_ = fVar202;
    auVar84._8_4_ = fVar202;
    auVar84._12_4_ = fVar202;
    auVar84._16_4_ = fVar202;
    auVar84._20_4_ = fVar202;
    auVar84._24_4_ = fVar202;
    auVar84._28_4_ = fVar202;
    auVar74._0_8_ = auVar61._0_8_;
    auVar74._8_8_ = auVar74._0_8_;
    auVar74._16_8_ = auVar74._0_8_;
    auVar74._24_8_ = auVar74._0_8_;
    auVar87 = vsubps_avx(auVar74,auVar84);
    uVar109 = auVar49._0_4_;
    auVar88._4_4_ = uVar109;
    auVar88._0_4_ = uVar109;
    auVar88._8_4_ = uVar109;
    auVar88._12_4_ = uVar109;
    auVar88._16_4_ = uVar109;
    auVar88._20_4_ = uVar109;
    auVar88._24_4_ = uVar109;
    auVar88._28_4_ = uVar109;
    auVar76._8_4_ = 1;
    auVar76._0_8_ = 0x100000001;
    auVar76._12_4_ = 1;
    auVar76._16_4_ = 1;
    auVar76._20_4_ = 1;
    auVar76._24_4_ = 1;
    auVar76._28_4_ = 1;
    auVar86 = ZEXT1632(auVar49);
    auVar85 = vpermps_avx2(auVar76,auVar86);
    auVar70 = vbroadcastss_avx512vl(auVar50);
    auVar80 = ZEXT1632(auVar50);
    auVar71 = vpermps_avx512vl(auVar76,auVar80);
    auVar72 = vbroadcastss_avx512vl(auVar51);
    auVar81 = ZEXT1632(auVar51);
    auVar73 = vpermps_avx512vl(auVar76,auVar81);
    auVar74 = vbroadcastss_avx512vl(auVar53);
    auVar83 = ZEXT1632(auVar53);
    auVar75 = vpermps_avx512vl(auVar76,auVar83);
    auVar89._4_4_ = fVar213;
    auVar89._0_4_ = fVar213;
    auVar89._8_4_ = fVar213;
    auVar89._12_4_ = fVar213;
    auVar89._16_4_ = fVar213;
    auVar89._20_4_ = fVar213;
    auVar89._24_4_ = fVar213;
    auVar89._28_4_ = fVar213;
    auVar82._8_4_ = 2;
    auVar82._0_8_ = 0x200000002;
    auVar82._12_4_ = 2;
    auVar82._16_4_ = 2;
    auVar82._20_4_ = 2;
    auVar82._24_4_ = 2;
    auVar82._28_4_ = 2;
    auVar76 = vpermps_avx512vl(auVar82,auVar86);
    auVar77 = vbroadcastss_avx512vl(ZEXT416(3));
    auVar78 = vpermps_avx512vl(auVar77,auVar86);
    auVar79 = vpermps_avx512vl(auVar82,auVar80);
    auVar80 = vpermps_avx512vl(auVar77,auVar80);
    auVar86 = vpermps_avx2(auVar82,auVar81);
    auVar81 = vpermps_avx512vl(auVar77,auVar81);
    auVar82 = vpermps_avx512vl(auVar82,auVar83);
    auVar77 = vpermps_avx512vl(auVar77,auVar83);
    auVar61 = vfmadd132ps_fma(auVar87,auVar84,_DAT_01faff20);
    auVar87 = vsubps_avx(auVar90,ZEXT1632(auVar61));
    auVar83 = vmulps_avx512vl(auVar70,ZEXT1632(auVar61));
    auVar90 = ZEXT1632(auVar61);
    auVar84 = vmulps_avx512vl(auVar71,auVar90);
    auVar53 = vfmadd231ps_fma(auVar83,auVar87,auVar88);
    auVar49 = vfmadd231ps_fma(auVar84,auVar87,auVar85);
    auVar83 = vmulps_avx512vl(auVar72,auVar90);
    auVar84 = vmulps_avx512vl(auVar73,auVar90);
    auVar83 = vfmadd231ps_avx512vl(auVar83,auVar87,auVar70);
    auVar84 = vfmadd231ps_avx512vl(auVar84,auVar87,auVar71);
    auVar70 = vmulps_avx512vl(auVar74,auVar90);
    auVar88 = ZEXT1632(auVar61);
    auVar71 = vmulps_avx512vl(auVar75,auVar88);
    auVar72 = vfmadd231ps_avx512vl(auVar70,auVar87,auVar72);
    auVar73 = vfmadd231ps_avx512vl(auVar71,auVar87,auVar73);
    fVar211 = auVar61._0_4_;
    fVar212 = auVar61._4_4_;
    auVar70._4_4_ = fVar212 * auVar83._4_4_;
    auVar70._0_4_ = fVar211 * auVar83._0_4_;
    fVar214 = auVar61._8_4_;
    auVar70._8_4_ = fVar214 * auVar83._8_4_;
    fVar224 = auVar61._12_4_;
    auVar70._12_4_ = fVar224 * auVar83._12_4_;
    auVar70._16_4_ = auVar83._16_4_ * 0.0;
    auVar70._20_4_ = auVar83._20_4_ * 0.0;
    auVar70._24_4_ = auVar83._24_4_ * 0.0;
    auVar70._28_4_ = fVar202;
    auVar71._4_4_ = fVar212 * auVar84._4_4_;
    auVar71._0_4_ = fVar211 * auVar84._0_4_;
    auVar71._8_4_ = fVar214 * auVar84._8_4_;
    auVar71._12_4_ = fVar224 * auVar84._12_4_;
    auVar71._16_4_ = auVar84._16_4_ * 0.0;
    auVar71._20_4_ = auVar84._20_4_ * 0.0;
    auVar71._24_4_ = auVar84._24_4_ * 0.0;
    auVar71._28_4_ = auVar85._28_4_;
    auVar53 = vfmadd231ps_fma(auVar70,auVar87,ZEXT1632(auVar53));
    auVar49 = vfmadd231ps_fma(auVar71,auVar87,ZEXT1632(auVar49));
    auVar75._0_4_ = fVar211 * auVar72._0_4_;
    auVar75._4_4_ = fVar212 * auVar72._4_4_;
    auVar75._8_4_ = fVar214 * auVar72._8_4_;
    auVar75._12_4_ = fVar224 * auVar72._12_4_;
    auVar75._16_4_ = auVar72._16_4_ * 0.0;
    auVar75._20_4_ = auVar72._20_4_ * 0.0;
    auVar75._24_4_ = auVar72._24_4_ * 0.0;
    auVar75._28_4_ = 0;
    auVar85._4_4_ = fVar212 * auVar73._4_4_;
    auVar85._0_4_ = fVar211 * auVar73._0_4_;
    auVar85._8_4_ = fVar214 * auVar73._8_4_;
    auVar85._12_4_ = fVar224 * auVar73._12_4_;
    auVar85._16_4_ = auVar73._16_4_ * 0.0;
    auVar85._20_4_ = auVar73._20_4_ * 0.0;
    auVar85._24_4_ = auVar73._24_4_ * 0.0;
    auVar85._28_4_ = auVar72._28_4_;
    auVar50 = vfmadd231ps_fma(auVar75,auVar87,auVar83);
    auVar51 = vfmadd231ps_fma(auVar85,auVar87,auVar84);
    auVar72._28_4_ = auVar84._28_4_;
    auVar72._0_28_ =
         ZEXT1628(CONCAT412(fVar224 * auVar51._12_4_,
                            CONCAT48(fVar214 * auVar51._8_4_,
                                     CONCAT44(fVar212 * auVar51._4_4_,fVar211 * auVar51._0_4_))));
    auVar52 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar224 * auVar50._12_4_,
                                                 CONCAT48(fVar214 * auVar50._8_4_,
                                                          CONCAT44(fVar212 * auVar50._4_4_,
                                                                   fVar211 * auVar50._0_4_)))),
                              auVar87,ZEXT1632(auVar53));
    auVar66 = vfmadd231ps_fma(auVar72,auVar87,ZEXT1632(auVar49));
    auVar85 = vsubps_avx(ZEXT1632(auVar50),ZEXT1632(auVar53));
    auVar70 = vsubps_avx(ZEXT1632(auVar51),ZEXT1632(auVar49));
    auVar71 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
    auVar85 = vmulps_avx512vl(auVar85,auVar71);
    auVar70 = vmulps_avx512vl(auVar70,auVar71);
    auVar83._0_4_ = fVar213 * auVar85._0_4_;
    auVar83._4_4_ = fVar213 * auVar85._4_4_;
    auVar83._8_4_ = fVar213 * auVar85._8_4_;
    auVar83._12_4_ = fVar213 * auVar85._12_4_;
    auVar83._16_4_ = fVar213 * auVar85._16_4_;
    auVar83._20_4_ = fVar213 * auVar85._20_4_;
    auVar83._24_4_ = fVar213 * auVar85._24_4_;
    auVar83._28_4_ = 0;
    auVar85 = vmulps_avx512vl(auVar89,auVar70);
    auVar49 = vxorps_avx512vl(auVar74._0_16_,auVar74._0_16_);
    auVar70 = vpermt2ps_avx512vl(ZEXT1632(auVar52),_DAT_01feed00,ZEXT1632(auVar49));
    auVar72 = vpermt2ps_avx512vl(ZEXT1632(auVar66),_DAT_01feed00,ZEXT1632(auVar49));
    auVar124._0_4_ = auVar83._0_4_ + auVar52._0_4_;
    auVar124._4_4_ = auVar83._4_4_ + auVar52._4_4_;
    auVar124._8_4_ = auVar83._8_4_ + auVar52._8_4_;
    auVar124._12_4_ = auVar83._12_4_ + auVar52._12_4_;
    auVar124._16_4_ = auVar83._16_4_ + 0.0;
    auVar124._20_4_ = auVar83._20_4_ + 0.0;
    auVar124._24_4_ = auVar83._24_4_ + 0.0;
    auVar124._28_4_ = 0;
    auVar84 = ZEXT1632(auVar49);
    auVar73 = vpermt2ps_avx512vl(auVar83,_DAT_01feed00,auVar84);
    auVar74 = vaddps_avx512vl(ZEXT1632(auVar66),auVar85);
    auVar75 = vpermt2ps_avx512vl(auVar85,_DAT_01feed00,auVar84);
    auVar85 = vsubps_avx(auVar70,auVar73);
    auVar75 = vsubps_avx512vl(auVar72,auVar75);
    auVar73 = vmulps_avx512vl(auVar79,auVar88);
    auVar83 = vmulps_avx512vl(auVar80,auVar88);
    auVar73 = vfmadd231ps_avx512vl(auVar73,auVar87,auVar76);
    auVar76 = vfmadd231ps_avx512vl(auVar83,auVar87,auVar78);
    auVar78 = vmulps_avx512vl(auVar86,auVar88);
    auVar83 = vmulps_avx512vl(auVar81,auVar88);
    auVar78 = vfmadd231ps_avx512vl(auVar78,auVar87,auVar79);
    auVar79 = vfmadd231ps_avx512vl(auVar83,auVar87,auVar80);
    auVar80 = vmulps_avx512vl(auVar82,auVar88);
    auVar77 = vmulps_avx512vl(auVar77,auVar88);
    auVar53 = vfmadd231ps_fma(auVar80,auVar87,auVar86);
    auVar86 = vfmadd231ps_avx512vl(auVar77,auVar87,auVar81);
    auVar77 = vmulps_avx512vl(auVar88,auVar78);
    auVar82 = ZEXT1632(auVar61);
    auVar80 = vmulps_avx512vl(auVar82,auVar79);
    auVar73 = vfmadd231ps_avx512vl(auVar77,auVar87,auVar73);
    auVar76 = vfmadd231ps_avx512vl(auVar80,auVar87,auVar76);
    auVar86 = vmulps_avx512vl(auVar82,auVar86);
    auVar77 = vfmadd231ps_avx512vl
                        (ZEXT1632(CONCAT412(fVar224 * auVar53._12_4_,
                                            CONCAT48(fVar214 * auVar53._8_4_,
                                                     CONCAT44(fVar212 * auVar53._4_4_,
                                                              fVar211 * auVar53._0_4_)))),auVar87,
                         auVar78);
    auVar78 = vfmadd231ps_avx512vl(auVar86,auVar87,auVar79);
    auVar86._4_4_ = fVar212 * auVar77._4_4_;
    auVar86._0_4_ = fVar211 * auVar77._0_4_;
    auVar86._8_4_ = fVar214 * auVar77._8_4_;
    auVar86._12_4_ = fVar224 * auVar77._12_4_;
    auVar86._16_4_ = auVar77._16_4_ * 0.0;
    auVar86._20_4_ = auVar77._20_4_ * 0.0;
    auVar86._24_4_ = auVar77._24_4_ * 0.0;
    auVar86._28_4_ = auVar81._28_4_;
    auVar79 = vmulps_avx512vl(auVar82,auVar78);
    auVar86 = vfmadd231ps_avx512vl(auVar86,auVar87,auVar73);
    auVar79 = vfmadd231ps_avx512vl(auVar79,auVar76,auVar87);
    auVar87 = vsubps_avx512vl(auVar77,auVar73);
    auVar73 = vsubps_avx512vl(auVar78,auVar76);
    auVar76 = vmulps_avx512vl(auVar87,auVar71);
    auVar71 = vmulps_avx512vl(auVar73,auVar71);
    fVar202 = fVar213 * auVar76._0_4_;
    fVar211 = fVar213 * auVar76._4_4_;
    auVar87._4_4_ = fVar211;
    auVar87._0_4_ = fVar202;
    fVar212 = fVar213 * auVar76._8_4_;
    auVar87._8_4_ = fVar212;
    fVar214 = fVar213 * auVar76._12_4_;
    auVar87._12_4_ = fVar214;
    fVar224 = fVar213 * auVar76._16_4_;
    auVar87._16_4_ = fVar224;
    fVar225 = fVar213 * auVar76._20_4_;
    auVar87._20_4_ = fVar225;
    fVar213 = fVar213 * auVar76._24_4_;
    auVar87._24_4_ = fVar213;
    auVar87._28_4_ = auVar76._28_4_;
    auVar71 = vmulps_avx512vl(auVar89,auVar71);
    auVar77 = vpermt2ps_avx512vl(auVar86,_DAT_01feed00,auVar84);
    auVar78 = vpermt2ps_avx512vl(auVar79,_DAT_01feed00,auVar84);
    auVar201._0_4_ = auVar86._0_4_ + fVar202;
    auVar201._4_4_ = auVar86._4_4_ + fVar211;
    auVar201._8_4_ = auVar86._8_4_ + fVar212;
    auVar201._12_4_ = auVar86._12_4_ + fVar214;
    auVar201._16_4_ = auVar86._16_4_ + fVar224;
    auVar201._20_4_ = auVar86._20_4_ + fVar225;
    auVar201._24_4_ = auVar86._24_4_ + fVar213;
    auVar201._28_4_ = auVar86._28_4_ + auVar76._28_4_;
    auVar87 = vpermt2ps_avx512vl(auVar87,_DAT_01feed00,ZEXT1632(auVar49));
    auVar76 = vaddps_avx512vl(auVar79,auVar71);
    auVar71 = vpermt2ps_avx512vl(auVar71,_DAT_01feed00,ZEXT1632(auVar49));
    auVar87 = vsubps_avx(auVar77,auVar87);
    auVar71 = vsubps_avx512vl(auVar78,auVar71);
    auVar91 = ZEXT1632(auVar52);
    auVar73 = vsubps_avx512vl(auVar86,auVar91);
    auVar93 = ZEXT1632(auVar66);
    auVar80 = vsubps_avx512vl(auVar79,auVar93);
    auVar81 = vsubps_avx512vl(auVar77,auVar70);
    auVar73 = vaddps_avx512vl(auVar73,auVar81);
    auVar81 = vsubps_avx512vl(auVar78,auVar72);
    auVar80 = vaddps_avx512vl(auVar80,auVar81);
    auVar81 = vmulps_avx512vl(auVar93,auVar73);
    auVar81 = vfnmadd231ps_avx512vl(auVar81,auVar91,auVar80);
    auVar82 = vmulps_avx512vl(auVar74,auVar73);
    auVar82 = vfnmadd231ps_avx512vl(auVar82,auVar124,auVar80);
    auVar83 = vmulps_avx512vl(auVar75,auVar73);
    auVar83 = vfnmadd231ps_avx512vl(auVar83,auVar85,auVar80);
    auVar84 = vmulps_avx512vl(auVar72,auVar73);
    auVar84 = vfnmadd231ps_avx512vl(auVar84,auVar70,auVar80);
    auVar88 = vmulps_avx512vl(auVar79,auVar73);
    auVar88 = vfnmadd231ps_avx512vl(auVar88,auVar86,auVar80);
    auVar89 = vmulps_avx512vl(auVar76,auVar73);
    auVar89 = vfnmadd231ps_avx512vl(auVar89,auVar201,auVar80);
    auVar90 = vmulps_avx512vl(auVar71,auVar73);
    auVar90 = vfnmadd231ps_avx512vl(auVar90,auVar87,auVar80);
    auVar73 = vmulps_avx512vl(auVar78,auVar73);
    auVar73 = vfnmadd231ps_avx512vl(auVar73,auVar77,auVar80);
    auVar80 = vminps_avx512vl(auVar81,auVar82);
    auVar81 = vmaxps_avx512vl(auVar81,auVar82);
    auVar82 = vminps_avx512vl(auVar83,auVar84);
    auVar80 = vminps_avx512vl(auVar80,auVar82);
    auVar82 = vmaxps_avx512vl(auVar83,auVar84);
    auVar81 = vmaxps_avx512vl(auVar81,auVar82);
    auVar82 = vminps_avx512vl(auVar88,auVar89);
    auVar83 = vmaxps_avx512vl(auVar88,auVar89);
    auVar84 = vminps_avx512vl(auVar90,auVar73);
    auVar82 = vminps_avx512vl(auVar82,auVar84);
    auVar80 = vminps_avx512vl(auVar80,auVar82);
    auVar73 = vmaxps_avx512vl(auVar90,auVar73);
    auVar73 = vmaxps_avx512vl(auVar83,auVar73);
    auVar81 = vmaxps_avx512vl(auVar81,auVar73);
    uVar13 = vcmpps_avx512vl(auVar80,local_1c0,2);
    auVar73._4_4_ = uStack_1dc;
    auVar73._0_4_ = local_1e0;
    auVar73._8_4_ = uStack_1d8;
    auVar73._12_4_ = uStack_1d4;
    auVar73._16_4_ = uStack_1d0;
    auVar73._20_4_ = uStack_1cc;
    auVar73._24_4_ = uStack_1c8;
    auVar73._28_4_ = uStack_1c4;
    uVar14 = vcmpps_avx512vl(auVar81,auVar73,5);
    bVar28 = (byte)uVar13 & (byte)uVar14 & 0x7f;
    if (bVar28 != 0) {
      auVar80 = vsubps_avx512vl(auVar70,auVar91);
      auVar81 = vsubps_avx512vl(auVar72,auVar93);
      auVar82 = vsubps_avx512vl(auVar77,auVar86);
      auVar80 = vaddps_avx512vl(auVar80,auVar82);
      auVar82 = vsubps_avx512vl(auVar78,auVar79);
      auVar81 = vaddps_avx512vl(auVar81,auVar82);
      auVar82 = vmulps_avx512vl(auVar93,auVar80);
      auVar82 = vfnmadd231ps_avx512vl(auVar82,auVar81,auVar91);
      auVar74 = vmulps_avx512vl(auVar74,auVar80);
      auVar74 = vfnmadd213ps_avx512vl(auVar124,auVar81,auVar74);
      auVar75 = vmulps_avx512vl(auVar75,auVar80);
      auVar75 = vfnmadd213ps_avx512vl(auVar85,auVar81,auVar75);
      auVar85 = vmulps_avx512vl(auVar72,auVar80);
      auVar72 = vfnmadd231ps_avx512vl(auVar85,auVar81,auVar70);
      auVar85 = vmulps_avx512vl(auVar79,auVar80);
      auVar79 = vfnmadd231ps_avx512vl(auVar85,auVar81,auVar86);
      auVar85 = vmulps_avx512vl(auVar76,auVar80);
      auVar76 = vfnmadd213ps_avx512vl(auVar201,auVar81,auVar85);
      auVar85 = vmulps_avx512vl(auVar71,auVar80);
      auVar83 = vfnmadd213ps_avx512vl(auVar87,auVar81,auVar85);
      auVar87 = vmulps_avx512vl(auVar78,auVar80);
      auVar77 = vfnmadd231ps_avx512vl(auVar87,auVar77,auVar81);
      auVar85 = vminps_avx(auVar82,auVar74);
      auVar87 = vmaxps_avx(auVar82,auVar74);
      auVar70 = vminps_avx(auVar75,auVar72);
      auVar70 = vminps_avx(auVar85,auVar70);
      auVar85 = vmaxps_avx(auVar75,auVar72);
      auVar87 = vmaxps_avx(auVar87,auVar85);
      auVar86 = vminps_avx(auVar79,auVar76);
      auVar85 = vmaxps_avx(auVar79,auVar76);
      auVar71 = vminps_avx(auVar83,auVar77);
      auVar86 = vminps_avx(auVar86,auVar71);
      auVar86 = vminps_avx(auVar70,auVar86);
      auVar70 = vmaxps_avx(auVar83,auVar77);
      auVar85 = vmaxps_avx(auVar85,auVar70);
      auVar87 = vmaxps_avx(auVar87,auVar85);
      uVar13 = vcmpps_avx512vl(auVar87,auVar73,5);
      uVar14 = vcmpps_avx512vl(auVar86,local_1c0,2);
      bVar28 = bVar28 & (byte)uVar13 & (byte)uVar14;
      if (bVar28 != 0) {
        auStack_430[uVar30] = (uint)bVar28;
        uVar13 = vmovlps_avx(auVar43);
        (&uStack_260)[uVar30] = uVar13;
        uVar35 = vmovlps_avx(auVar115);
        auStack_1a0[uVar30] = uVar35;
        uVar30 = (ulong)((int)uVar30 + 1);
      }
    }
    auVar43 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
    auVar244 = ZEXT1664(auVar43);
    auVar87 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
    auVar245 = ZEXT3264(auVar87);
    auVar43 = vbroadcastss_avx512vl(ZEXT416(0x3e124925));
    auVar246 = ZEXT1664(auVar43);
    auVar247 = ZEXT3264(_DAT_01feed20);
LAB_01ae4ed5:
    do {
      do {
        do {
          auVar53 = auVar249._0_16_;
          auVar61 = SUB6416(ZEXT464(0xb8d1b717),0);
          if ((int)uVar30 == 0) {
            uVar109 = *(undefined4 *)(ray + k * 4 + 0x100);
            auVar20._4_4_ = uVar109;
            auVar20._0_4_ = uVar109;
            auVar20._8_4_ = uVar109;
            auVar20._12_4_ = uVar109;
            uVar13 = vcmpps_avx512vl(local_400,auVar20,2);
            uVar36 = (uint)uVar42 & (uint)uVar13;
            uVar42 = (ulong)uVar36;
            if (uVar36 == 0) {
              return;
            }
            goto LAB_01ae4273;
          }
          uVar29 = (int)uVar30 - 1;
          uVar31 = (ulong)uVar29;
          uVar5 = auStack_430[uVar31];
          auVar115._8_8_ = 0;
          auVar115._0_8_ = auStack_1a0[uVar31];
          uVar35 = 0;
          for (uVar34 = (ulong)uVar5; (uVar34 & 1) == 0; uVar34 = uVar34 >> 1 | 0x8000000000000000)
          {
            uVar35 = uVar35 + 1;
          }
          uVar33 = uVar5 - 1 & uVar5;
          bVar39 = uVar33 == 0;
          auStack_430[uVar31] = uVar33;
          if (bVar39) {
            uVar30 = (ulong)uVar29;
          }
          auVar105._8_8_ = 0;
          auVar105._0_8_ = uVar35;
          auVar43 = vpunpcklqdq_avx(auVar105,ZEXT416((int)uVar35 + 1));
          auVar43 = vcvtqq2ps_avx512vl(auVar43);
          auVar43 = vmulps_avx512vl(auVar43,auVar246._0_16_);
          uVar109 = *(undefined4 *)((long)&uStack_260 + uVar31 * 8 + 4);
          auVar15._4_4_ = uVar109;
          auVar15._0_4_ = uVar109;
          auVar15._8_4_ = uVar109;
          auVar15._12_4_ = uVar109;
          auVar49 = vmulps_avx512vl(auVar43,auVar15);
          auVar43 = vsubps_avx512vl(auVar53,auVar43);
          uVar109 = *(undefined4 *)(&uStack_260 + uVar31);
          auVar16._4_4_ = uVar109;
          auVar16._0_4_ = uVar109;
          auVar16._8_4_ = uVar109;
          auVar16._12_4_ = uVar109;
          auVar43 = vfmadd231ps_avx512vl(auVar49,auVar43,auVar16);
          auVar49 = vmovshdup_avx(auVar43);
          fVar213 = auVar49._0_4_ - auVar43._0_4_;
          vucomiss_avx512f(ZEXT416((uint)fVar213));
          if (uVar5 == 0 || bVar39) goto LAB_01ae49cb;
          auVar49 = vshufps_avx(auVar115,auVar115,0x50);
          vucomiss_avx512f(ZEXT416((uint)fVar213));
          bVar37 = (uint)uVar30 < 4;
          uVar29 = (uint)uVar30 - 4;
          bVar40 = uVar29 == 0;
          bVar38 = (POPCOUNT(uVar29 & 0xff) & 1U) == 0;
          auVar52 = vsubps_avx512vl(auVar53,auVar49);
          fVar202 = auVar49._0_4_;
          auVar150._0_4_ = fVar202 * fVar117;
          fVar211 = auVar49._4_4_;
          auVar150._4_4_ = fVar211 * fVar125;
          fVar212 = auVar49._8_4_;
          auVar150._8_4_ = fVar212 * fVar117;
          fVar214 = auVar49._12_4_;
          auVar150._12_4_ = fVar214 * fVar125;
          auVar164._0_4_ = fVar202 * fVar126;
          auVar164._4_4_ = fVar211 * fVar127;
          auVar164._8_4_ = fVar212 * fVar126;
          auVar164._12_4_ = fVar214 * fVar127;
          auVar170._0_4_ = fVar202 * fVar138;
          auVar170._4_4_ = fVar211 * fVar144;
          auVar170._8_4_ = fVar212 * fVar138;
          auVar170._12_4_ = fVar214 * fVar144;
          auVar133._0_4_ = fVar202 * fVar145;
          auVar133._4_4_ = fVar211 * fVar146;
          auVar133._8_4_ = fVar212 * fVar145;
          auVar133._12_4_ = fVar214 * fVar146;
          auVar49 = vfmadd231ps_fma(auVar150,auVar52,auVar44);
          auVar50 = vfmadd231ps_fma(auVar164,auVar52,auVar56);
          auVar51 = vfmadd231ps_fma(auVar170,auVar52,auVar55);
          auVar52 = vfmadd231ps_fma(auVar133,auVar52,auVar54);
          auVar78._16_16_ = auVar49;
          auVar78._0_16_ = auVar49;
          auVar79._16_16_ = auVar50;
          auVar79._0_16_ = auVar50;
          auVar81._16_16_ = auVar51;
          auVar81._0_16_ = auVar51;
          auVar85 = vpermps_avx512vl(auVar247._0_32_,ZEXT1632(auVar43));
          auVar87 = vsubps_avx(auVar79,auVar78);
          auVar50 = vfmadd213ps_fma(auVar87,auVar85,auVar78);
          auVar87 = vsubps_avx(auVar81,auVar79);
          auVar66 = vfmadd213ps_fma(auVar87,auVar85,auVar79);
          auVar49 = vsubps_avx(auVar52,auVar51);
          auVar80._16_16_ = auVar49;
          auVar80._0_16_ = auVar49;
          auVar49 = vfmadd213ps_fma(auVar80,auVar85,auVar81);
          auVar87 = vsubps_avx(ZEXT1632(auVar66),ZEXT1632(auVar50));
          auVar50 = vfmadd213ps_fma(auVar87,auVar85,ZEXT1632(auVar50));
          auVar87 = vsubps_avx(ZEXT1632(auVar49),ZEXT1632(auVar66));
          auVar49 = vfmadd213ps_fma(auVar87,auVar85,ZEXT1632(auVar66));
          auVar87 = vsubps_avx(ZEXT1632(auVar49),ZEXT1632(auVar50));
          auVar139 = vfmadd231ps_fma(ZEXT1632(auVar50),auVar87,auVar85);
          auVar87 = vmulps_avx512vl(auVar87,auVar245._0_32_);
          auVar77._16_16_ = auVar87._16_16_;
          auVar49 = vmulss_avx512f(ZEXT416((uint)fVar213),SUB6416(ZEXT464(0x3eaaaaab),0));
          fVar202 = auVar49._0_4_;
          auVar171._0_8_ =
               CONCAT44(auVar139._4_4_ + fVar202 * auVar87._4_4_,
                        auVar139._0_4_ + fVar202 * auVar87._0_4_);
          auVar171._8_4_ = auVar139._8_4_ + fVar202 * auVar87._8_4_;
          auVar171._12_4_ = auVar139._12_4_ + fVar202 * auVar87._12_4_;
          auVar151._0_4_ = fVar202 * auVar87._16_4_;
          auVar151._4_4_ = fVar202 * auVar87._20_4_;
          auVar151._8_4_ = fVar202 * auVar87._24_4_;
          auVar151._12_4_ = fVar202 * auVar87._28_4_;
          auVar63 = vsubps_avx((undefined1  [16])0x0,auVar151);
          auVar66 = vshufpd_avx(auVar139,auVar139,3);
          auVar64 = vshufpd_avx((undefined1  [16])0x0,(undefined1  [16])0x0,3);
          auVar49 = vsubps_avx(auVar66,auVar139);
          auVar50 = vsubps_avx(auVar64,(undefined1  [16])0x0);
          auVar190._0_4_ = auVar49._0_4_ + auVar50._0_4_;
          auVar190._4_4_ = auVar49._4_4_ + auVar50._4_4_;
          auVar190._8_4_ = auVar49._8_4_ + auVar50._8_4_;
          auVar190._12_4_ = auVar49._12_4_ + auVar50._12_4_;
          auVar49 = vshufps_avx(auVar139,auVar139,0xb1);
          auVar50 = vshufps_avx(auVar171,auVar171,0xb1);
          auVar51 = vshufps_avx(auVar63,auVar63,0xb1);
          auVar52 = vshufps_avx((undefined1  [16])0x0,(undefined1  [16])0x0,0xb1);
          auVar237._4_4_ = auVar190._0_4_;
          auVar237._0_4_ = auVar190._0_4_;
          auVar237._8_4_ = auVar190._0_4_;
          auVar237._12_4_ = auVar190._0_4_;
          auVar59 = vshufps_avx(auVar190,auVar190,0x55);
          fVar202 = auVar59._0_4_;
          auVar199._0_4_ = auVar49._0_4_ * fVar202;
          fVar211 = auVar59._4_4_;
          auVar199._4_4_ = auVar49._4_4_ * fVar211;
          fVar212 = auVar59._8_4_;
          auVar199._8_4_ = auVar49._8_4_ * fVar212;
          fVar214 = auVar59._12_4_;
          auVar199._12_4_ = auVar49._12_4_ * fVar214;
          auVar204._0_4_ = auVar50._0_4_ * fVar202;
          auVar204._4_4_ = auVar50._4_4_ * fVar211;
          auVar204._8_4_ = auVar50._8_4_ * fVar212;
          auVar204._12_4_ = auVar50._12_4_ * fVar214;
          auVar216._0_4_ = auVar51._0_4_ * fVar202;
          auVar216._4_4_ = auVar51._4_4_ * fVar211;
          auVar216._8_4_ = auVar51._8_4_ * fVar212;
          auVar216._12_4_ = auVar51._12_4_ * fVar214;
          auVar191._0_4_ = auVar52._0_4_ * fVar202;
          auVar191._4_4_ = auVar52._4_4_ * fVar211;
          auVar191._8_4_ = auVar52._8_4_ * fVar212;
          auVar191._12_4_ = auVar52._12_4_ * fVar214;
          auVar49 = vfmadd231ps_fma(auVar199,auVar237,auVar139);
          auVar50 = vfmadd231ps_fma(auVar204,auVar237,auVar171);
          auVar62 = vfmadd231ps_fma(auVar216,auVar237,auVar63);
          auVar69 = vfmadd231ps_fma(auVar191,(undefined1  [16])0x0,auVar237);
          auVar59 = vshufpd_avx(auVar49,auVar49,1);
          auVar60 = vshufpd_avx(auVar50,auVar50,1);
          auVar57 = vshufpd_avx512vl(auVar62,auVar62,1);
          auVar58 = vshufpd_avx512vl(auVar69,auVar69,1);
          auVar51 = vminss_avx(auVar49,auVar50);
          auVar49 = vmaxss_avx(auVar50,auVar49);
          auVar52 = vminss_avx(auVar62,auVar69);
          auVar50 = vmaxss_avx(auVar69,auVar62);
          auVar51 = vminss_avx(auVar51,auVar52);
          auVar49 = vmaxss_avx(auVar50,auVar49);
          auVar52 = vminss_avx(auVar59,auVar60);
          auVar50 = vmaxss_avx(auVar60,auVar59);
          auVar59 = vminss_avx512f(auVar57,auVar58);
          auVar60 = vmaxss_avx512f(auVar58,auVar57);
          vmaxss_avx(auVar60,auVar50);
          auVar50 = vminss_avx512f(auVar52,auVar59);
          vucomiss_avx512f(auVar51);
          if ((!bVar37 && !bVar40) &&
             (auVar52 = vucomiss_avx512f(auVar61), bVar41 = bVar40, !bVar37 && !bVar40)) break;
          auVar52 = vucomiss_avx512f(auVar61);
          auVar59 = vucomiss_avx512f(auVar50);
          auVar49 = vucomiss_avx512f(auVar61);
          bVar41 = bVar37 || bVar40;
          bVar38 = bVar37 || bVar40;
          if (!bVar37 && !bVar40) break;
          uVar13 = vcmpps_avx512vl(auVar51,auVar59,5);
          uVar14 = vcmpps_avx512vl(auVar50,auVar59,5);
          uVar29 = (uint)uVar13 & (uint)uVar14;
          bVar10 = (uVar29 & 1) == 0;
          bVar41 = (!bVar37 && !bVar40) && bVar10;
          bVar38 = (!bVar37 && !bVar40) && (uVar29 & 1) == 0;
        } while ((bVar37 || bVar40) || !bVar10);
        auVar60 = auVar250._0_16_;
        vcmpss_avx512f(auVar51,auVar60,1);
        uVar13 = vcmpss_avx512f(auVar49,auVar60,1);
        bVar40 = (bool)((byte)uVar13 & 1);
        auVar77._0_16_ = auVar251._0_16_;
        auVar91._4_28_ = auVar77._4_28_;
        auVar91._0_4_ = (float)((uint)bVar40 * -0x40800000 + (uint)!bVar40 * auVar251._0_4_);
        vucomiss_avx512f(auVar91._0_16_);
        bVar38 = (bool)(!bVar41 | bVar38);
        bVar41 = bVar38 == false;
        auVar93._16_16_ = auVar77._16_16_;
        auVar93._0_16_ = SUB6416(ZEXT464(0x7f800000),0);
        auVar92._4_28_ = auVar93._4_28_;
        auVar92._0_4_ = (uint)bVar38 * auVar250._0_4_ + (uint)!bVar38 * 0x7f800000;
        auVar59 = auVar92._0_16_;
        auVar95._16_16_ = auVar77._16_16_;
        auVar95._0_16_ = SUB6416(ZEXT464(0xff800000),0);
        auVar94._4_28_ = auVar95._4_28_;
        auVar94._0_4_ = (uint)bVar38 * auVar250._0_4_ + (uint)!bVar38 * -0x800000;
        auVar61 = auVar94._0_16_;
        uVar13 = vcmpss_avx512f(auVar50,auVar60,1);
        bVar40 = (bool)((byte)uVar13 & 1);
        auVar97._16_16_ = auVar77._16_16_;
        auVar97._0_16_ = auVar251._0_16_;
        auVar96._4_28_ = auVar97._4_28_;
        auVar96._0_4_ = (float)((uint)bVar40 * -0x40800000 + (uint)!bVar40 * auVar251._0_4_);
        vucomiss_avx512f(auVar96._0_16_);
        if ((bVar38) || (bVar41)) {
          auVar50 = vucomiss_avx512f(auVar51);
          if ((bVar38) || (bVar41)) {
            auVar19._8_4_ = 0x80000000;
            auVar19._0_8_ = 0x8000000080000000;
            auVar19._12_4_ = 0x80000000;
            auVar62 = vxorps_avx512vl(auVar51,auVar19);
            auVar50 = vsubss_avx512f(auVar50,auVar51);
            auVar50 = vdivss_avx512f(auVar62,auVar50);
            auVar51 = vsubss_avx512f(ZEXT416(0x3f800000),auVar50);
            auVar51 = vfmadd213ss_avx512f(auVar51,auVar60,auVar50);
            auVar50 = auVar51;
          }
          else {
            auVar50 = vxorps_avx512vl(auVar50,auVar50);
            vucomiss_avx512f(auVar50);
            auVar51 = ZEXT416(0x3f800000);
            if ((bVar38) || (bVar41)) {
              auVar51 = SUB6416(ZEXT464(0xff800000),0);
              auVar50 = SUB6416(ZEXT464(0x7f800000),0);
            }
          }
          auVar59 = vminss_avx512f(auVar59,auVar50);
          auVar61 = vmaxss_avx(auVar51,auVar61);
        }
        auVar251 = ZEXT464(0x3f800000);
        uVar13 = vcmpss_avx512f(auVar52,auVar60,1);
        bVar38 = (bool)((byte)uVar13 & 1);
        auVar50 = auVar251._0_16_;
        fVar202 = (float)((uint)bVar38 * -0x40800000 + (uint)!bVar38 * 0x3f800000);
        if ((auVar91._0_4_ != fVar202) || (NAN(auVar91._0_4_) || NAN(fVar202))) {
          fVar212 = auVar52._0_4_;
          fVar211 = auVar49._0_4_;
          if ((fVar212 != fVar211) || (NAN(fVar212) || NAN(fVar211))) {
            auVar18._8_4_ = 0x80000000;
            auVar18._0_8_ = 0x8000000080000000;
            auVar18._12_4_ = 0x80000000;
            auVar49 = vxorps_avx512vl(auVar49,auVar18);
            auVar192._0_4_ = auVar49._0_4_ / (fVar212 - fVar211);
            auVar192._4_12_ = auVar49._4_12_;
            auVar49 = vsubss_avx512f(auVar50,auVar192);
            auVar49 = vfmadd213ss_avx512f(auVar49,auVar60,auVar192);
            auVar51 = auVar49;
          }
          else if ((fVar211 != 0.0) ||
                  (auVar49 = auVar50, auVar51 = ZEXT816(0) << 0x40, NAN(fVar211))) {
            auVar49 = SUB6416(ZEXT464(0xff800000),0);
            auVar51 = SUB6416(ZEXT464(0x7f800000),0);
          }
          auVar59 = vminss_avx(auVar59,auVar51);
          auVar61 = vmaxss_avx(auVar49,auVar61);
        }
        bVar38 = auVar96._0_4_ != fVar202;
        auVar49 = vminss_avx512f(auVar59,auVar50);
        auVar99._16_16_ = auVar77._16_16_;
        auVar99._0_16_ = auVar59;
        auVar98._4_28_ = auVar99._4_28_;
        auVar98._0_4_ = (uint)bVar38 * auVar49._0_4_ + (uint)!bVar38 * auVar59._0_4_;
        auVar49 = vmaxss_avx512f(auVar50,auVar61);
        auVar101._16_16_ = auVar77._16_16_;
        auVar101._0_16_ = auVar61;
        auVar100._4_28_ = auVar101._4_28_;
        auVar100._0_4_ = (uint)bVar38 * auVar49._0_4_ + (uint)!bVar38 * auVar61._0_4_;
        auVar61 = vmaxss_avx512f(auVar60,auVar98._0_16_);
        auVar49 = vminss_avx512f(auVar100._0_16_,auVar50);
      } while (auVar49._0_4_ < auVar61._0_4_);
      auVar52 = vmaxss_avx512f(auVar60,ZEXT416((uint)(auVar61._0_4_ + -0.1)));
      auVar62 = vminss_avx512f(ZEXT416((uint)(auVar49._0_4_ + 0.1)),auVar50);
      auVar134._0_8_ = auVar139._0_8_;
      auVar134._8_8_ = auVar134._0_8_;
      auVar205._8_8_ = auVar171._0_8_;
      auVar205._0_8_ = auVar171._0_8_;
      auVar217._8_8_ = auVar63._0_8_;
      auVar217._0_8_ = auVar63._0_8_;
      auVar61 = vshufpd_avx(auVar171,auVar171,3);
      auVar49 = vshufpd_avx(auVar63,auVar63,3);
      auVar51 = vshufps_avx(auVar52,auVar62,0);
      auVar60 = vsubps_avx512vl(auVar53,auVar51);
      fVar202 = auVar51._0_4_;
      auVar165._0_4_ = fVar202 * auVar66._0_4_;
      fVar211 = auVar51._4_4_;
      auVar165._4_4_ = fVar211 * auVar66._4_4_;
      fVar212 = auVar51._8_4_;
      auVar165._8_4_ = fVar212 * auVar66._8_4_;
      fVar214 = auVar51._12_4_;
      auVar165._12_4_ = fVar214 * auVar66._12_4_;
      auVar172._0_4_ = fVar202 * auVar61._0_4_;
      auVar172._4_4_ = fVar211 * auVar61._4_4_;
      auVar172._8_4_ = fVar212 * auVar61._8_4_;
      auVar172._12_4_ = fVar214 * auVar61._12_4_;
      auVar240._0_4_ = auVar49._0_4_ * fVar202;
      auVar240._4_4_ = auVar49._4_4_ * fVar211;
      auVar240._8_4_ = auVar49._8_4_ * fVar212;
      auVar240._12_4_ = auVar49._12_4_ * fVar214;
      auVar152._0_4_ = fVar202 * auVar64._0_4_;
      auVar152._4_4_ = fVar211 * auVar64._4_4_;
      auVar152._8_4_ = fVar212 * auVar64._8_4_;
      auVar152._12_4_ = fVar214 * auVar64._12_4_;
      auVar66 = vfmadd231ps_fma(auVar165,auVar60,auVar134);
      auVar64 = vfmadd231ps_fma(auVar172,auVar60,auVar205);
      auVar59 = vfmadd231ps_fma(auVar240,auVar60,auVar217);
      auVar60 = vfmadd231ps_fma(auVar152,auVar60,ZEXT816(0));
      auVar49 = vsubss_avx512f(auVar50,auVar52);
      auVar61 = vmovshdup_avx(auVar115);
      auVar139 = vfmadd231ss_fma(ZEXT416((uint)(auVar61._0_4_ * auVar52._0_4_)),auVar115,auVar49);
      auVar49 = vsubss_avx512f(auVar50,auVar62);
      auVar57 = vfmadd231ss_fma(ZEXT416((uint)(auVar61._0_4_ * auVar62._0_4_)),auVar115,auVar49);
      auVar63 = vdivss_avx512f(auVar50,ZEXT416((uint)fVar213));
      auVar61 = vsubps_avx(auVar64,auVar66);
      auVar62 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
      auVar51 = vmulps_avx512vl(auVar61,auVar62);
      auVar61 = vsubps_avx(auVar59,auVar64);
      auVar52 = vmulps_avx512vl(auVar61,auVar62);
      auVar61 = vsubps_avx(auVar60,auVar59);
      auVar61 = vmulps_avx512vl(auVar61,auVar62);
      auVar49 = vminps_avx(auVar52,auVar61);
      auVar61 = vmaxps_avx(auVar52,auVar61);
      auVar49 = vminps_avx(auVar51,auVar49);
      auVar61 = vmaxps_avx(auVar51,auVar61);
      auVar51 = vshufpd_avx(auVar49,auVar49,3);
      auVar52 = vshufpd_avx(auVar61,auVar61,3);
      auVar49 = vminps_avx(auVar49,auVar51);
      auVar61 = vmaxps_avx(auVar61,auVar52);
      fVar213 = auVar63._0_4_;
      auVar193._0_4_ = auVar49._0_4_ * fVar213;
      auVar193._4_4_ = auVar49._4_4_ * fVar213;
      auVar193._8_4_ = auVar49._8_4_ * fVar213;
      auVar193._12_4_ = auVar49._12_4_ * fVar213;
      auVar179._0_4_ = fVar213 * auVar61._0_4_;
      auVar179._4_4_ = fVar213 * auVar61._4_4_;
      auVar179._8_4_ = fVar213 * auVar61._8_4_;
      auVar179._12_4_ = fVar213 * auVar61._12_4_;
      auVar63 = vdivss_avx512f(auVar50,ZEXT416((uint)(auVar57._0_4_ - auVar139._0_4_)));
      auVar61 = vshufpd_avx(auVar66,auVar66,3);
      auVar49 = vshufpd_avx(auVar64,auVar64,3);
      auVar51 = vshufpd_avx(auVar59,auVar59,3);
      auVar52 = vshufpd_avx(auVar60,auVar60,3);
      auVar61 = vsubps_avx(auVar61,auVar66);
      auVar66 = vsubps_avx(auVar49,auVar64);
      auVar64 = vsubps_avx(auVar51,auVar59);
      auVar52 = vsubps_avx(auVar52,auVar60);
      auVar49 = vminps_avx(auVar61,auVar66);
      auVar61 = vmaxps_avx(auVar61,auVar66);
      auVar51 = vminps_avx(auVar64,auVar52);
      auVar51 = vminps_avx(auVar49,auVar51);
      auVar49 = vmaxps_avx(auVar64,auVar52);
      auVar61 = vmaxps_avx(auVar61,auVar49);
      fVar213 = auVar63._0_4_;
      auVar218._0_4_ = fVar213 * auVar51._0_4_;
      auVar218._4_4_ = fVar213 * auVar51._4_4_;
      auVar218._8_4_ = fVar213 * auVar51._8_4_;
      auVar218._12_4_ = fVar213 * auVar51._12_4_;
      auVar206._0_4_ = fVar213 * auVar61._0_4_;
      auVar206._4_4_ = fVar213 * auVar61._4_4_;
      auVar206._8_4_ = fVar213 * auVar61._8_4_;
      auVar206._12_4_ = fVar213 * auVar61._12_4_;
      auVar52 = vinsertps_avx(auVar43,auVar139,0x10);
      auVar58 = vpermt2ps_avx512vl(auVar43,_DAT_01feecd0,auVar57);
      auVar116._0_4_ = auVar52._0_4_ + auVar58._0_4_;
      auVar116._4_4_ = auVar52._4_4_ + auVar58._4_4_;
      auVar116._8_4_ = auVar52._8_4_ + auVar58._8_4_;
      auVar116._12_4_ = auVar52._12_4_ + auVar58._12_4_;
      auVar63 = vmulps_avx512vl(auVar116,auVar244._0_16_);
      auVar49 = vshufps_avx(auVar63,auVar63,0x54);
      uVar109 = auVar63._0_4_;
      auVar123._4_4_ = uVar109;
      auVar123._0_4_ = uVar109;
      auVar123._8_4_ = uVar109;
      auVar123._12_4_ = uVar109;
      auVar64 = vfmadd213ps_avx512vl(local_290,auVar123,auVar45);
      auVar51 = vfmadd213ps_fma(local_2a0,auVar123,local_440);
      auVar66 = vfmadd213ps_fma(local_2b0,auVar123,local_450);
      auVar61 = vsubps_avx(auVar51,auVar64);
      auVar64 = vfmadd213ps_fma(auVar61,auVar123,auVar64);
      auVar61 = vsubps_avx(auVar66,auVar51);
      auVar61 = vfmadd213ps_fma(auVar61,auVar123,auVar51);
      auVar61 = vsubps_avx(auVar61,auVar64);
      auVar51 = vfmadd231ps_fma(auVar64,auVar61,auVar123);
      auVar59 = vmulps_avx512vl(auVar61,auVar62);
      auVar229._8_8_ = auVar51._0_8_;
      auVar229._0_8_ = auVar51._0_8_;
      auVar61 = vshufpd_avx(auVar51,auVar51,3);
      auVar51 = vshufps_avx(auVar63,auVar63,0x55);
      auVar66 = vsubps_avx(auVar61,auVar229);
      auVar64 = vfmadd231ps_fma(auVar229,auVar51,auVar66);
      auVar241._8_8_ = auVar59._0_8_;
      auVar241._0_8_ = auVar59._0_8_;
      auVar61 = vshufpd_avx(auVar59,auVar59,3);
      auVar61 = vsubps_avx512vl(auVar61,auVar241);
      auVar61 = vfmadd213ps_avx512vl(auVar61,auVar51,auVar241);
      auVar51 = vxorps_avx512vl(auVar66,auVar252._0_16_);
      auVar59 = vmovshdup_avx512vl(auVar61);
      auVar60 = vxorps_avx512vl(auVar59,auVar252._0_16_);
      auVar62 = vmovshdup_avx512vl(auVar66);
      auVar60 = vpermt2ps_avx512vl(auVar60,ZEXT416(5),auVar66);
      auVar65 = vxorps_avx512vl(ZEXT416(5),ZEXT416(5));
      auVar250 = ZEXT1664(auVar65);
      auVar66 = vfmsub231ss_avx512f(ZEXT416((uint)(auVar59._0_4_ * auVar66._0_4_)),auVar61,auVar62);
      auVar51 = vpermt2ps_avx512vl(auVar61,SUB6416(ZEXT464(4),0),auVar51);
      auVar153._0_4_ = auVar66._0_4_;
      auVar153._4_4_ = auVar153._0_4_;
      auVar153._8_4_ = auVar153._0_4_;
      auVar153._12_4_ = auVar153._0_4_;
      auVar61 = vdivps_avx(auVar60,auVar153);
      auVar67 = vdivps_avx512vl(auVar51,auVar153);
      fVar213 = auVar64._0_4_;
      auVar51 = vshufps_avx(auVar64,auVar64,0x55);
      auVar230._0_4_ = fVar213 * auVar61._0_4_ + auVar51._0_4_ * auVar67._0_4_;
      auVar230._4_4_ = fVar213 * auVar61._4_4_ + auVar51._4_4_ * auVar67._4_4_;
      auVar230._8_4_ = fVar213 * auVar61._8_4_ + auVar51._8_4_ * auVar67._8_4_;
      auVar230._12_4_ = fVar213 * auVar61._12_4_ + auVar51._12_4_ * auVar67._12_4_;
      auVar62 = vsubps_avx(auVar49,auVar230);
      auVar51 = vmovshdup_avx(auVar61);
      auVar49 = vinsertps_avx(auVar193,auVar218,0x1c);
      auVar242._0_4_ = auVar51._0_4_ * auVar49._0_4_;
      auVar242._4_4_ = auVar51._4_4_ * auVar49._4_4_;
      auVar242._8_4_ = auVar51._8_4_ * auVar49._8_4_;
      auVar242._12_4_ = auVar51._12_4_ * auVar49._12_4_;
      auVar69 = vinsertps_avx512f(auVar179,auVar206,0x1c);
      auVar51 = vmulps_avx512vl(auVar51,auVar69);
      auVar60 = vminps_avx512vl(auVar242,auVar51);
      auVar64 = vmaxps_avx(auVar51,auVar242);
      auVar59 = vmovshdup_avx(auVar67);
      auVar51 = vinsertps_avx(auVar218,auVar193,0x4c);
      auVar219._0_4_ = auVar59._0_4_ * auVar51._0_4_;
      auVar219._4_4_ = auVar59._4_4_ * auVar51._4_4_;
      auVar219._8_4_ = auVar59._8_4_ * auVar51._8_4_;
      auVar219._12_4_ = auVar59._12_4_ * auVar51._12_4_;
      auVar66 = vinsertps_avx(auVar206,auVar179,0x4c);
      auVar207._0_4_ = auVar59._0_4_ * auVar66._0_4_;
      auVar207._4_4_ = auVar59._4_4_ * auVar66._4_4_;
      auVar207._8_4_ = auVar59._8_4_ * auVar66._8_4_;
      auVar207._12_4_ = auVar59._12_4_ * auVar66._12_4_;
      auVar59 = vminps_avx(auVar219,auVar207);
      auVar60 = vaddps_avx512vl(auVar60,auVar59);
      auVar59 = vmaxps_avx(auVar207,auVar219);
      auVar208._0_4_ = auVar64._0_4_ + auVar59._0_4_;
      auVar208._4_4_ = auVar64._4_4_ + auVar59._4_4_;
      auVar208._8_4_ = auVar64._8_4_ + auVar59._8_4_;
      auVar208._12_4_ = auVar64._12_4_ + auVar59._12_4_;
      auVar220._8_8_ = 0x3f80000000000000;
      auVar220._0_8_ = 0x3f80000000000000;
      auVar64 = vsubps_avx(auVar220,auVar208);
      auVar59 = vsubps_avx(auVar220,auVar60);
      auVar60 = vsubps_avx(auVar52,auVar63);
      auVar63 = vsubps_avx(auVar58,auVar63);
      fVar214 = auVar60._0_4_;
      auVar243._0_4_ = fVar214 * auVar64._0_4_;
      fVar224 = auVar60._4_4_;
      auVar243._4_4_ = fVar224 * auVar64._4_4_;
      fVar225 = auVar60._8_4_;
      auVar243._8_4_ = fVar225 * auVar64._8_4_;
      fVar226 = auVar60._12_4_;
      auVar243._12_4_ = fVar226 * auVar64._12_4_;
      auVar68 = vbroadcastss_avx512vl(auVar61);
      auVar49 = vmulps_avx512vl(auVar68,auVar49);
      auVar69 = vmulps_avx512vl(auVar68,auVar69);
      auVar68 = vminps_avx512vl(auVar49,auVar69);
      auVar69 = vmaxps_avx512vl(auVar69,auVar49);
      auVar49 = vbroadcastss_avx512vl(auVar67);
      auVar51 = vmulps_avx512vl(auVar49,auVar51);
      auVar49 = vmulps_avx512vl(auVar49,auVar66);
      auVar66 = vminps_avx512vl(auVar51,auVar49);
      auVar66 = vaddps_avx512vl(auVar68,auVar66);
      auVar60 = vmulps_avx512vl(auVar60,auVar59);
      fVar213 = auVar63._0_4_;
      auVar209._0_4_ = fVar213 * auVar64._0_4_;
      fVar202 = auVar63._4_4_;
      auVar209._4_4_ = fVar202 * auVar64._4_4_;
      fVar211 = auVar63._8_4_;
      auVar209._8_4_ = fVar211 * auVar64._8_4_;
      fVar212 = auVar63._12_4_;
      auVar209._12_4_ = fVar212 * auVar64._12_4_;
      auVar221._0_4_ = fVar213 * auVar59._0_4_;
      auVar221._4_4_ = fVar202 * auVar59._4_4_;
      auVar221._8_4_ = fVar211 * auVar59._8_4_;
      auVar221._12_4_ = fVar212 * auVar59._12_4_;
      auVar49 = vmaxps_avx(auVar49,auVar51);
      auVar180._0_4_ = auVar69._0_4_ + auVar49._0_4_;
      auVar180._4_4_ = auVar69._4_4_ + auVar49._4_4_;
      auVar180._8_4_ = auVar69._8_4_ + auVar49._8_4_;
      auVar180._12_4_ = auVar69._12_4_ + auVar49._12_4_;
      auVar194._8_8_ = 0x3f800000;
      auVar194._0_8_ = 0x3f800000;
      auVar49 = vsubps_avx(auVar194,auVar180);
      auVar51 = vsubps_avx512vl(auVar194,auVar66);
      auVar238._0_4_ = fVar214 * auVar49._0_4_;
      auVar238._4_4_ = fVar224 * auVar49._4_4_;
      auVar238._8_4_ = fVar225 * auVar49._8_4_;
      auVar238._12_4_ = fVar226 * auVar49._12_4_;
      auVar231._0_4_ = fVar214 * auVar51._0_4_;
      auVar231._4_4_ = fVar224 * auVar51._4_4_;
      auVar231._8_4_ = fVar225 * auVar51._8_4_;
      auVar231._12_4_ = fVar226 * auVar51._12_4_;
      auVar181._0_4_ = fVar213 * auVar49._0_4_;
      auVar181._4_4_ = fVar202 * auVar49._4_4_;
      auVar181._8_4_ = fVar211 * auVar49._8_4_;
      auVar181._12_4_ = fVar212 * auVar49._12_4_;
      auVar195._0_4_ = fVar213 * auVar51._0_4_;
      auVar195._4_4_ = fVar202 * auVar51._4_4_;
      auVar195._8_4_ = fVar211 * auVar51._8_4_;
      auVar195._12_4_ = fVar212 * auVar51._12_4_;
      auVar49 = vminps_avx(auVar238,auVar231);
      auVar51 = vminps_avx512vl(auVar181,auVar195);
      auVar66 = vminps_avx512vl(auVar49,auVar51);
      auVar49 = vmaxps_avx(auVar231,auVar238);
      auVar51 = vmaxps_avx(auVar195,auVar181);
      auVar51 = vmaxps_avx(auVar51,auVar49);
      auVar64 = vminps_avx512vl(auVar243,auVar60);
      auVar49 = vminps_avx(auVar209,auVar221);
      auVar49 = vminps_avx(auVar64,auVar49);
      auVar49 = vhaddps_avx(auVar66,auVar49);
      auVar64 = vmaxps_avx512vl(auVar60,auVar243);
      auVar66 = vmaxps_avx(auVar221,auVar209);
      auVar66 = vmaxps_avx(auVar66,auVar64);
      auVar51 = vhaddps_avx(auVar51,auVar66);
      auVar49 = vshufps_avx(auVar49,auVar49,0xe8);
      auVar51 = vshufps_avx(auVar51,auVar51,0xe8);
      auVar182._0_4_ = auVar49._0_4_ + auVar62._0_4_;
      auVar182._4_4_ = auVar49._4_4_ + auVar62._4_4_;
      auVar182._8_4_ = auVar49._8_4_ + auVar62._8_4_;
      auVar182._12_4_ = auVar49._12_4_ + auVar62._12_4_;
      auVar196._0_4_ = auVar51._0_4_ + auVar62._0_4_;
      auVar196._4_4_ = auVar51._4_4_ + auVar62._4_4_;
      auVar196._8_4_ = auVar51._8_4_ + auVar62._8_4_;
      auVar196._12_4_ = auVar51._12_4_ + auVar62._12_4_;
      auVar49 = vmaxps_avx(auVar52,auVar182);
      auVar51 = vminps_avx(auVar196,auVar58);
      uVar35 = vcmpps_avx512vl(auVar51,auVar49,1);
    } while ((uVar35 & 3) != 0);
    uVar35 = vcmpps_avx512vl(auVar196,auVar58,1);
    uVar13 = vcmpps_avx512vl(auVar43,auVar182,1);
    if (((ushort)uVar13 & (ushort)uVar35 & 1) == 0) {
      bVar28 = 0;
    }
    else {
      auVar49 = vmovshdup_avx(auVar182);
      bVar28 = auVar139._0_4_ < auVar49._0_4_ & (byte)(uVar35 >> 1) & 0x7f;
    }
    if (((!bVar37 || uVar5 != 0 && !bVar39) | bVar28) == 1) {
      lVar32 = 200;
      do {
        auVar43 = vsubss_avx512f(auVar50,auVar62);
        fVar211 = auVar43._0_4_;
        fVar213 = fVar211 * fVar211 * fVar211;
        fVar212 = auVar62._0_4_;
        fVar202 = fVar212 * 3.0 * fVar211 * fVar211;
        fVar211 = fVar211 * fVar212 * fVar212 * 3.0;
        auVar141._4_4_ = fVar213;
        auVar141._0_4_ = fVar213;
        auVar141._8_4_ = fVar213;
        auVar141._12_4_ = fVar213;
        auVar135._4_4_ = fVar202;
        auVar135._0_4_ = fVar202;
        auVar135._8_4_ = fVar202;
        auVar135._12_4_ = fVar202;
        auVar106._4_4_ = fVar211;
        auVar106._0_4_ = fVar211;
        auVar106._8_4_ = fVar211;
        auVar106._12_4_ = fVar211;
        fVar212 = fVar212 * fVar212 * fVar212;
        auVar166._0_4_ = fVar212 * (float)local_270._0_4_;
        auVar166._4_4_ = fVar212 * (float)local_270._4_4_;
        auVar166._8_4_ = fVar212 * fStack_268;
        auVar166._12_4_ = fVar212 * fStack_264;
        auVar43 = vfmadd231ps_fma(auVar166,local_450,auVar106);
        auVar43 = vfmadd231ps_fma(auVar43,local_440,auVar135);
        auVar43 = vfmadd231ps_fma(auVar43,auVar45,auVar141);
        auVar107._8_8_ = auVar43._0_8_;
        auVar107._0_8_ = auVar43._0_8_;
        auVar43 = vshufpd_avx(auVar43,auVar43,3);
        auVar49 = vshufps_avx(auVar62,auVar62,0x55);
        auVar43 = vsubps_avx(auVar43,auVar107);
        auVar49 = vfmadd213ps_fma(auVar43,auVar49,auVar107);
        fVar213 = auVar49._0_4_;
        auVar43 = vshufps_avx(auVar49,auVar49,0x55);
        auVar108._0_4_ = auVar61._0_4_ * fVar213 + auVar67._0_4_ * auVar43._0_4_;
        auVar108._4_4_ = auVar61._4_4_ * fVar213 + auVar67._4_4_ * auVar43._4_4_;
        auVar108._8_4_ = auVar61._8_4_ * fVar213 + auVar67._8_4_ * auVar43._8_4_;
        auVar108._12_4_ = auVar61._12_4_ * fVar213 + auVar67._12_4_ * auVar43._12_4_;
        auVar62 = vsubps_avx(auVar62,auVar108);
        auVar43 = vandps_avx512vl(auVar49,auVar248._0_16_);
        auVar49 = vprolq_avx512vl(auVar43,0x20);
        auVar43 = vmaxss_avx(auVar49,auVar43);
        bVar39 = (float)local_280._0_4_ < auVar43._0_4_;
        if (auVar43._0_4_ < (float)local_280._0_4_) {
          auVar43 = vucomiss_avx512f(auVar65);
          if (bVar39) break;
          auVar61 = vucomiss_avx512f(auVar43);
          auVar251 = ZEXT1664(auVar61);
          if (bVar39) break;
          vmovshdup_avx(auVar43);
          auVar61 = vucomiss_avx512f(auVar65);
          if (bVar39) break;
          auVar49 = vucomiss_avx512f(auVar61);
          auVar251 = ZEXT1664(auVar49);
          if (bVar39) break;
          auVar50 = vinsertps_avx(ZEXT416((uint)pre->ray_space[k].vx.field_0.m128[2]),
                                  ZEXT416((uint)pre->ray_space[k].vy.field_0.m128[2]),0x1c);
          auVar63 = vinsertps_avx(auVar50,ZEXT416((uint)pre->ray_space[k].vz.field_0.m128[2]),0x28);
          auVar50 = vdpps_avx(auVar63,local_2c0,0x7f);
          auVar51 = vdpps_avx(auVar63,local_2d0,0x7f);
          auVar52 = vdpps_avx(auVar63,local_2e0,0x7f);
          auVar66 = vdpps_avx(auVar63,local_2f0,0x7f);
          auVar64 = vdpps_avx(auVar63,local_300,0x7f);
          auVar59 = vdpps_avx(auVar63,local_310,0x7f);
          auVar60 = vdpps_avx(auVar63,local_320,0x7f);
          auVar63 = vdpps_avx(auVar63,local_330,0x7f);
          auVar62 = vsubss_avx512f(auVar49,auVar61);
          fVar212 = auVar61._0_4_;
          auVar61 = vfmadd231ss_fma(ZEXT416((uint)(fVar212 * auVar64._0_4_)),auVar62,auVar50);
          auVar50 = vfmadd231ss_fma(ZEXT416((uint)(auVar59._0_4_ * fVar212)),auVar62,auVar51);
          auVar51 = vfmadd231ss_fma(ZEXT416((uint)(auVar60._0_4_ * fVar212)),auVar62,auVar52);
          auVar52 = vfmadd231ss_fma(ZEXT416((uint)(fVar212 * auVar63._0_4_)),auVar62,auVar66);
          auVar49 = vsubss_avx512f(auVar49,auVar43);
          auVar173._0_4_ = auVar49._0_4_;
          fVar213 = auVar173._0_4_ * auVar173._0_4_ * auVar173._0_4_;
          local_120 = auVar43._0_4_;
          fVar202 = local_120 * 3.0 * auVar173._0_4_ * auVar173._0_4_;
          fVar211 = auVar173._0_4_ * local_120 * local_120 * 3.0;
          fVar224 = local_120 * local_120 * local_120;
          auVar49 = vfmadd231ss_fma(ZEXT416((uint)(fVar224 * auVar52._0_4_)),ZEXT416((uint)fVar211),
                                    auVar51);
          auVar49 = vfmadd231ss_fma(auVar49,ZEXT416((uint)fVar202),auVar50);
          auVar61 = vfmadd231ss_fma(auVar49,ZEXT416((uint)fVar213),auVar61);
          fVar214 = auVar61._0_4_;
          if ((fVar214 < fVar102) || (fVar225 = *(float *)(ray + k * 4 + 0x100), fVar225 < fVar214))
          break;
          auVar61 = vshufps_avx(auVar43,auVar43,0x55);
          auVar50 = vsubps_avx512vl(auVar53,auVar61);
          fVar226 = auVar61._0_4_;
          auVar200._0_4_ = fVar226 * (float)local_350._0_4_;
          fVar227 = auVar61._4_4_;
          auVar200._4_4_ = fVar227 * (float)local_350._4_4_;
          fVar232 = auVar61._8_4_;
          auVar200._8_4_ = fVar232 * fStack_348;
          fVar233 = auVar61._12_4_;
          auVar200._12_4_ = fVar233 * fStack_344;
          auVar210._0_4_ = fVar226 * (float)local_3a0._0_4_;
          auVar210._4_4_ = fVar227 * (float)local_3a0._4_4_;
          auVar210._8_4_ = fVar232 * fStack_398;
          auVar210._12_4_ = fVar233 * fStack_394;
          auVar222._0_4_ = fVar226 * (float)local_3b0._0_4_;
          auVar222._4_4_ = fVar227 * (float)local_3b0._4_4_;
          auVar222._8_4_ = fVar232 * fStack_3a8;
          auVar222._12_4_ = fVar233 * fStack_3a4;
          auVar183._0_4_ = fVar226 * (float)local_370._0_4_;
          auVar183._4_4_ = fVar227 * (float)local_370._4_4_;
          auVar183._8_4_ = fVar232 * fStack_368;
          auVar183._12_4_ = fVar233 * fStack_364;
          auVar61 = vfmadd231ps_fma(auVar200,auVar50,local_340);
          auVar53 = vfmadd231ps_fma(auVar210,auVar50,local_380);
          auVar49 = vfmadd231ps_fma(auVar222,auVar50,local_390);
          auVar50 = vfmadd231ps_fma(auVar183,auVar50,local_360);
          auVar61 = vsubps_avx(auVar53,auVar61);
          auVar53 = vsubps_avx(auVar49,auVar53);
          auVar49 = vsubps_avx(auVar50,auVar49);
          auVar223._0_4_ = local_120 * auVar53._0_4_;
          auVar223._4_4_ = local_120 * auVar53._4_4_;
          auVar223._8_4_ = local_120 * auVar53._8_4_;
          auVar223._12_4_ = local_120 * auVar53._12_4_;
          auVar173._4_4_ = auVar173._0_4_;
          auVar173._8_4_ = auVar173._0_4_;
          auVar173._12_4_ = auVar173._0_4_;
          auVar61 = vfmadd231ps_fma(auVar223,auVar173,auVar61);
          auVar184._0_4_ = local_120 * auVar49._0_4_;
          auVar184._4_4_ = local_120 * auVar49._4_4_;
          auVar184._8_4_ = local_120 * auVar49._8_4_;
          auVar184._12_4_ = local_120 * auVar49._12_4_;
          auVar53 = vfmadd231ps_fma(auVar184,auVar173,auVar53);
          auVar185._0_4_ = local_120 * auVar53._0_4_;
          auVar185._4_4_ = local_120 * auVar53._4_4_;
          auVar185._8_4_ = local_120 * auVar53._8_4_;
          auVar185._12_4_ = local_120 * auVar53._12_4_;
          auVar61 = vfmadd231ps_fma(auVar185,auVar173,auVar61);
          auVar17._8_4_ = 0x40400000;
          auVar17._0_8_ = 0x4040000040400000;
          auVar17._12_4_ = 0x40400000;
          auVar61 = vmulps_avx512vl(auVar61,auVar17);
          pGVar6 = (context->scene->geometries).items[uVar36].ptr;
          if ((pGVar6->mask & *(uint *)(ray + k * 4 + 0x120)) == 0) break;
          auVar167._0_4_ = fVar224 * (float)local_3f0._0_4_;
          auVar167._4_4_ = fVar224 * (float)local_3f0._4_4_;
          auVar167._8_4_ = fVar224 * fStack_3e8;
          auVar167._12_4_ = fVar224 * fStack_3e4;
          auVar154._4_4_ = fVar211;
          auVar154._0_4_ = fVar211;
          auVar154._8_4_ = fVar211;
          auVar154._12_4_ = fVar211;
          auVar53 = vfmadd132ps_fma(auVar154,auVar167,local_3e0);
          auVar142._4_4_ = fVar202;
          auVar142._0_4_ = fVar202;
          auVar142._8_4_ = fVar202;
          auVar142._12_4_ = fVar202;
          auVar53 = vfmadd132ps_fma(auVar142,auVar53,local_3d0);
          auVar136._4_4_ = fVar213;
          auVar136._0_4_ = fVar213;
          auVar136._8_4_ = fVar213;
          auVar136._12_4_ = fVar213;
          auVar50 = vfmadd132ps_fma(auVar136,auVar53,local_3c0);
          auVar53 = vshufps_avx(auVar50,auVar50,0xc9);
          auVar49 = vshufps_avx(auVar61,auVar61,0xc9);
          auVar137._0_4_ = auVar50._0_4_ * auVar49._0_4_;
          auVar137._4_4_ = auVar50._4_4_ * auVar49._4_4_;
          auVar137._8_4_ = auVar50._8_4_ * auVar49._8_4_;
          auVar137._12_4_ = auVar50._12_4_ * auVar49._12_4_;
          auVar61 = vfmsub231ps_fma(auVar137,auVar61,auVar53);
          local_140 = auVar61._0_4_;
          if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
             (pGVar6->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
            *(float *)(ray + k * 4 + 0x100) = fVar214;
            uVar109 = vextractps_avx(auVar61,1);
            *(undefined4 *)(ray + k * 4 + 0x180) = uVar109;
            uVar109 = vextractps_avx(auVar61,2);
            *(undefined4 *)(ray + k * 4 + 0x1a0) = uVar109;
            *(undefined4 *)(ray + k * 4 + 0x1c0) = local_140;
            *(float *)(ray + k * 4 + 0x1e0) = local_120;
            *(float *)(ray + k * 4 + 0x200) = fVar212;
            *(uint *)(ray + k * 4 + 0x220) = uVar4;
            *(uint *)(ray + k * 4 + 0x240) = uVar36;
            *(uint *)(ray + k * 4 + 0x260) = context->user->instID[0];
            *(uint *)(ray + k * 4 + 0x280) = context->user->instPrimID[0];
            break;
          }
          auVar143._8_4_ = 1;
          auVar143._0_8_ = 0x100000001;
          auVar143._12_4_ = 1;
          auVar143._16_4_ = 1;
          auVar143._20_4_ = 1;
          auVar143._24_4_ = 1;
          auVar143._28_4_ = 1;
          local_100 = vpermps_avx2(auVar143,ZEXT1632(auVar43));
          auVar87 = vpermps_avx2(auVar143,ZEXT1632(auVar61));
          auVar155._8_4_ = 2;
          auVar155._0_8_ = 0x200000002;
          auVar155._12_4_ = 2;
          auVar155._16_4_ = 2;
          auVar155._20_4_ = 2;
          auVar155._24_4_ = 2;
          auVar155._28_4_ = 2;
          local_160 = vpermps_avx2(auVar155,ZEXT1632(auVar61));
          local_180[0] = (RTCHitN)auVar87[0];
          local_180[1] = (RTCHitN)auVar87[1];
          local_180[2] = (RTCHitN)auVar87[2];
          local_180[3] = (RTCHitN)auVar87[3];
          local_180[4] = (RTCHitN)auVar87[4];
          local_180[5] = (RTCHitN)auVar87[5];
          local_180[6] = (RTCHitN)auVar87[6];
          local_180[7] = (RTCHitN)auVar87[7];
          local_180[8] = (RTCHitN)auVar87[8];
          local_180[9] = (RTCHitN)auVar87[9];
          local_180[10] = (RTCHitN)auVar87[10];
          local_180[0xb] = (RTCHitN)auVar87[0xb];
          local_180[0xc] = (RTCHitN)auVar87[0xc];
          local_180[0xd] = (RTCHitN)auVar87[0xd];
          local_180[0xe] = (RTCHitN)auVar87[0xe];
          local_180[0xf] = (RTCHitN)auVar87[0xf];
          local_180[0x10] = (RTCHitN)auVar87[0x10];
          local_180[0x11] = (RTCHitN)auVar87[0x11];
          local_180[0x12] = (RTCHitN)auVar87[0x12];
          local_180[0x13] = (RTCHitN)auVar87[0x13];
          local_180[0x14] = (RTCHitN)auVar87[0x14];
          local_180[0x15] = (RTCHitN)auVar87[0x15];
          local_180[0x16] = (RTCHitN)auVar87[0x16];
          local_180[0x17] = (RTCHitN)auVar87[0x17];
          local_180[0x18] = (RTCHitN)auVar87[0x18];
          local_180[0x19] = (RTCHitN)auVar87[0x19];
          local_180[0x1a] = (RTCHitN)auVar87[0x1a];
          local_180[0x1b] = (RTCHitN)auVar87[0x1b];
          local_180[0x1c] = (RTCHitN)auVar87[0x1c];
          local_180[0x1d] = (RTCHitN)auVar87[0x1d];
          local_180[0x1e] = (RTCHitN)auVar87[0x1e];
          local_180[0x1f] = (RTCHitN)auVar87[0x1f];
          uStack_13c = local_140;
          uStack_138 = local_140;
          uStack_134 = local_140;
          uStack_130 = local_140;
          uStack_12c = local_140;
          uStack_128 = local_140;
          uStack_124 = local_140;
          fStack_11c = local_120;
          fStack_118 = local_120;
          fStack_114 = local_120;
          fStack_110 = local_120;
          fStack_10c = local_120;
          fStack_108 = local_120;
          fStack_104 = local_120;
          local_e0 = local_220._0_8_;
          uStack_d8 = local_220._8_8_;
          uStack_d0 = local_220._16_8_;
          uStack_c8 = local_220._24_8_;
          local_c0 = local_200;
          vpcmpeqd_avx2(local_200,local_200);
          uStack_9c = context->user->instID[0];
          local_a0 = uStack_9c;
          uStack_98 = uStack_9c;
          uStack_94 = uStack_9c;
          uStack_90 = uStack_9c;
          uStack_8c = uStack_9c;
          uStack_88 = uStack_9c;
          uStack_84 = uStack_9c;
          uStack_7c = context->user->instPrimID[0];
          local_80 = uStack_7c;
          uStack_78 = uStack_7c;
          uStack_74 = uStack_7c;
          uStack_70 = uStack_7c;
          uStack_6c = uStack_7c;
          uStack_68 = uStack_7c;
          uStack_64 = uStack_7c;
          *(float *)(ray + k * 4 + 0x100) = fVar214;
          local_420 = local_240;
          local_480.valid = (int *)local_420;
          local_480.geometryUserPtr = pGVar6->userPtr;
          local_480.context = context->user;
          local_480.hit = local_180;
          local_480.N = 8;
          local_480.ray = (RTCRayN *)ray;
          if (pGVar6->intersectionFilterN != (RTCFilterFunctionN)0x0) {
            (*pGVar6->intersectionFilterN)(&local_480);
            auVar43 = vxorps_avx512vl(auVar65,auVar65);
            auVar250 = ZEXT1664(auVar43);
            auVar251 = ZEXT464(0x3f800000);
            auVar247 = ZEXT3264(_DAT_01feed20);
            auVar43 = vbroadcastss_avx512vl(ZEXT416(0x3e124925));
            auVar246 = ZEXT1664(auVar43);
            auVar87 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
            auVar245 = ZEXT3264(auVar87);
            auVar43 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
            auVar244 = ZEXT1664(auVar43);
            auVar43 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
            auVar252 = ZEXT1664(auVar43);
            auVar43 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
            auVar249 = ZEXT1664(auVar43);
            auVar43 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
            auVar248 = ZEXT1664(auVar43);
          }
          auVar43 = auVar250._0_16_;
          if (local_420 != (undefined1  [32])0x0) {
            p_Var7 = context->args->filter;
            if ((p_Var7 != (RTCFilterFunctionN)0x0) &&
               (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                 RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar6->field_8).field_0x2 & 0x40) != 0)))) {
              (*p_Var7)(&local_480);
              auVar43 = vxorps_avx512vl(auVar43,auVar43);
              auVar250 = ZEXT1664(auVar43);
              auVar251 = ZEXT464(0x3f800000);
              auVar247 = ZEXT3264(_DAT_01feed20);
              auVar43 = vbroadcastss_avx512vl(ZEXT416(0x3e124925));
              auVar246 = ZEXT1664(auVar43);
              auVar87 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
              auVar245 = ZEXT3264(auVar87);
              auVar43 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
              auVar244 = ZEXT1664(auVar43);
              auVar43 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
              auVar252 = ZEXT1664(auVar43);
              auVar43 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
              auVar249 = ZEXT1664(auVar43);
              auVar43 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
              auVar248 = ZEXT1664(auVar43);
            }
            if (local_420 != (undefined1  [32])0x0) {
              uVar35 = vptestmd_avx512vl(local_420,local_420);
              iVar21 = *(int *)(local_480.hit + 4);
              iVar22 = *(int *)(local_480.hit + 8);
              iVar23 = *(int *)(local_480.hit + 0xc);
              iVar24 = *(int *)(local_480.hit + 0x10);
              iVar25 = *(int *)(local_480.hit + 0x14);
              iVar26 = *(int *)(local_480.hit + 0x18);
              iVar27 = *(int *)(local_480.hit + 0x1c);
              bVar28 = (byte)uVar35;
              bVar39 = (bool)((byte)(uVar35 >> 1) & 1);
              bVar38 = (bool)((byte)(uVar35 >> 2) & 1);
              bVar37 = (bool)((byte)(uVar35 >> 3) & 1);
              bVar40 = (bool)((byte)(uVar35 >> 4) & 1);
              bVar41 = (bool)((byte)(uVar35 >> 5) & 1);
              bVar10 = (bool)((byte)(uVar35 >> 6) & 1);
              bVar11 = SUB81(uVar35 >> 7,0);
              *(uint *)(local_480.ray + 0x180) =
                   (uint)(bVar28 & 1) * *(int *)local_480.hit |
                   (uint)!(bool)(bVar28 & 1) * *(int *)(local_480.ray + 0x180);
              *(uint *)(local_480.ray + 0x184) =
                   (uint)bVar39 * iVar21 | (uint)!bVar39 * *(int *)(local_480.ray + 0x184);
              *(uint *)(local_480.ray + 0x188) =
                   (uint)bVar38 * iVar22 | (uint)!bVar38 * *(int *)(local_480.ray + 0x188);
              *(uint *)(local_480.ray + 0x18c) =
                   (uint)bVar37 * iVar23 | (uint)!bVar37 * *(int *)(local_480.ray + 0x18c);
              *(uint *)(local_480.ray + 400) =
                   (uint)bVar40 * iVar24 | (uint)!bVar40 * *(int *)(local_480.ray + 400);
              *(uint *)(local_480.ray + 0x194) =
                   (uint)bVar41 * iVar25 | (uint)!bVar41 * *(int *)(local_480.ray + 0x194);
              *(uint *)(local_480.ray + 0x198) =
                   (uint)bVar10 * iVar26 | (uint)!bVar10 * *(int *)(local_480.ray + 0x198);
              *(uint *)(local_480.ray + 0x19c) =
                   (uint)bVar11 * iVar27 | (uint)!bVar11 * *(int *)(local_480.ray + 0x19c);
              iVar21 = *(int *)(local_480.hit + 0x24);
              iVar22 = *(int *)(local_480.hit + 0x28);
              iVar23 = *(int *)(local_480.hit + 0x2c);
              iVar24 = *(int *)(local_480.hit + 0x30);
              iVar25 = *(int *)(local_480.hit + 0x34);
              iVar26 = *(int *)(local_480.hit + 0x38);
              iVar27 = *(int *)(local_480.hit + 0x3c);
              bVar39 = (bool)((byte)(uVar35 >> 1) & 1);
              bVar38 = (bool)((byte)(uVar35 >> 2) & 1);
              bVar37 = (bool)((byte)(uVar35 >> 3) & 1);
              bVar40 = (bool)((byte)(uVar35 >> 4) & 1);
              bVar41 = (bool)((byte)(uVar35 >> 5) & 1);
              bVar10 = (bool)((byte)(uVar35 >> 6) & 1);
              bVar11 = SUB81(uVar35 >> 7,0);
              *(uint *)(local_480.ray + 0x1a0) =
                   (uint)(bVar28 & 1) * *(int *)(local_480.hit + 0x20) |
                   (uint)!(bool)(bVar28 & 1) * *(int *)(local_480.ray + 0x1a0);
              *(uint *)(local_480.ray + 0x1a4) =
                   (uint)bVar39 * iVar21 | (uint)!bVar39 * *(int *)(local_480.ray + 0x1a4);
              *(uint *)(local_480.ray + 0x1a8) =
                   (uint)bVar38 * iVar22 | (uint)!bVar38 * *(int *)(local_480.ray + 0x1a8);
              *(uint *)(local_480.ray + 0x1ac) =
                   (uint)bVar37 * iVar23 | (uint)!bVar37 * *(int *)(local_480.ray + 0x1ac);
              *(uint *)(local_480.ray + 0x1b0) =
                   (uint)bVar40 * iVar24 | (uint)!bVar40 * *(int *)(local_480.ray + 0x1b0);
              *(uint *)(local_480.ray + 0x1b4) =
                   (uint)bVar41 * iVar25 | (uint)!bVar41 * *(int *)(local_480.ray + 0x1b4);
              *(uint *)(local_480.ray + 0x1b8) =
                   (uint)bVar10 * iVar26 | (uint)!bVar10 * *(int *)(local_480.ray + 0x1b8);
              *(uint *)(local_480.ray + 0x1bc) =
                   (uint)bVar11 * iVar27 | (uint)!bVar11 * *(int *)(local_480.ray + 0x1bc);
              iVar21 = *(int *)(local_480.hit + 0x44);
              iVar22 = *(int *)(local_480.hit + 0x48);
              iVar23 = *(int *)(local_480.hit + 0x4c);
              iVar24 = *(int *)(local_480.hit + 0x50);
              iVar25 = *(int *)(local_480.hit + 0x54);
              iVar26 = *(int *)(local_480.hit + 0x58);
              iVar27 = *(int *)(local_480.hit + 0x5c);
              bVar39 = (bool)((byte)(uVar35 >> 1) & 1);
              bVar38 = (bool)((byte)(uVar35 >> 2) & 1);
              bVar37 = (bool)((byte)(uVar35 >> 3) & 1);
              bVar40 = (bool)((byte)(uVar35 >> 4) & 1);
              bVar41 = (bool)((byte)(uVar35 >> 5) & 1);
              bVar10 = (bool)((byte)(uVar35 >> 6) & 1);
              bVar11 = SUB81(uVar35 >> 7,0);
              *(uint *)(local_480.ray + 0x1c0) =
                   (uint)(bVar28 & 1) * *(int *)(local_480.hit + 0x40) |
                   (uint)!(bool)(bVar28 & 1) * *(int *)(local_480.ray + 0x1c0);
              *(uint *)(local_480.ray + 0x1c4) =
                   (uint)bVar39 * iVar21 | (uint)!bVar39 * *(int *)(local_480.ray + 0x1c4);
              *(uint *)(local_480.ray + 0x1c8) =
                   (uint)bVar38 * iVar22 | (uint)!bVar38 * *(int *)(local_480.ray + 0x1c8);
              *(uint *)(local_480.ray + 0x1cc) =
                   (uint)bVar37 * iVar23 | (uint)!bVar37 * *(int *)(local_480.ray + 0x1cc);
              *(uint *)(local_480.ray + 0x1d0) =
                   (uint)bVar40 * iVar24 | (uint)!bVar40 * *(int *)(local_480.ray + 0x1d0);
              *(uint *)(local_480.ray + 0x1d4) =
                   (uint)bVar41 * iVar25 | (uint)!bVar41 * *(int *)(local_480.ray + 0x1d4);
              *(uint *)(local_480.ray + 0x1d8) =
                   (uint)bVar10 * iVar26 | (uint)!bVar10 * *(int *)(local_480.ray + 0x1d8);
              *(uint *)(local_480.ray + 0x1dc) =
                   (uint)bVar11 * iVar27 | (uint)!bVar11 * *(int *)(local_480.ray + 0x1dc);
              iVar21 = *(int *)(local_480.hit + 100);
              iVar22 = *(int *)(local_480.hit + 0x68);
              iVar23 = *(int *)(local_480.hit + 0x6c);
              iVar24 = *(int *)(local_480.hit + 0x70);
              iVar25 = *(int *)(local_480.hit + 0x74);
              iVar26 = *(int *)(local_480.hit + 0x78);
              iVar27 = *(int *)(local_480.hit + 0x7c);
              bVar39 = (bool)((byte)(uVar35 >> 1) & 1);
              bVar38 = (bool)((byte)(uVar35 >> 2) & 1);
              bVar37 = (bool)((byte)(uVar35 >> 3) & 1);
              bVar40 = (bool)((byte)(uVar35 >> 4) & 1);
              bVar41 = (bool)((byte)(uVar35 >> 5) & 1);
              bVar10 = (bool)((byte)(uVar35 >> 6) & 1);
              bVar11 = SUB81(uVar35 >> 7,0);
              *(uint *)(local_480.ray + 0x1e0) =
                   (uint)(bVar28 & 1) * *(int *)(local_480.hit + 0x60) |
                   (uint)!(bool)(bVar28 & 1) * *(int *)(local_480.ray + 0x1e0);
              *(uint *)(local_480.ray + 0x1e4) =
                   (uint)bVar39 * iVar21 | (uint)!bVar39 * *(int *)(local_480.ray + 0x1e4);
              *(uint *)(local_480.ray + 0x1e8) =
                   (uint)bVar38 * iVar22 | (uint)!bVar38 * *(int *)(local_480.ray + 0x1e8);
              *(uint *)(local_480.ray + 0x1ec) =
                   (uint)bVar37 * iVar23 | (uint)!bVar37 * *(int *)(local_480.ray + 0x1ec);
              *(uint *)(local_480.ray + 0x1f0) =
                   (uint)bVar40 * iVar24 | (uint)!bVar40 * *(int *)(local_480.ray + 0x1f0);
              *(uint *)(local_480.ray + 500) =
                   (uint)bVar41 * iVar25 | (uint)!bVar41 * *(int *)(local_480.ray + 500);
              *(uint *)(local_480.ray + 0x1f8) =
                   (uint)bVar10 * iVar26 | (uint)!bVar10 * *(int *)(local_480.ray + 0x1f8);
              *(uint *)(local_480.ray + 0x1fc) =
                   (uint)bVar11 * iVar27 | (uint)!bVar11 * *(int *)(local_480.ray + 0x1fc);
              iVar21 = *(int *)(local_480.hit + 0x84);
              iVar22 = *(int *)(local_480.hit + 0x88);
              iVar23 = *(int *)(local_480.hit + 0x8c);
              iVar24 = *(int *)(local_480.hit + 0x90);
              iVar25 = *(int *)(local_480.hit + 0x94);
              iVar26 = *(int *)(local_480.hit + 0x98);
              iVar27 = *(int *)(local_480.hit + 0x9c);
              bVar39 = (bool)((byte)(uVar35 >> 1) & 1);
              bVar38 = (bool)((byte)(uVar35 >> 2) & 1);
              bVar37 = (bool)((byte)(uVar35 >> 3) & 1);
              bVar40 = (bool)((byte)(uVar35 >> 4) & 1);
              bVar41 = (bool)((byte)(uVar35 >> 5) & 1);
              bVar10 = (bool)((byte)(uVar35 >> 6) & 1);
              bVar11 = SUB81(uVar35 >> 7,0);
              *(uint *)(local_480.ray + 0x200) =
                   (uint)(bVar28 & 1) * *(int *)(local_480.hit + 0x80) |
                   (uint)!(bool)(bVar28 & 1) * *(int *)(local_480.ray + 0x200);
              *(uint *)(local_480.ray + 0x204) =
                   (uint)bVar39 * iVar21 | (uint)!bVar39 * *(int *)(local_480.ray + 0x204);
              *(uint *)(local_480.ray + 0x208) =
                   (uint)bVar38 * iVar22 | (uint)!bVar38 * *(int *)(local_480.ray + 0x208);
              *(uint *)(local_480.ray + 0x20c) =
                   (uint)bVar37 * iVar23 | (uint)!bVar37 * *(int *)(local_480.ray + 0x20c);
              *(uint *)(local_480.ray + 0x210) =
                   (uint)bVar40 * iVar24 | (uint)!bVar40 * *(int *)(local_480.ray + 0x210);
              *(uint *)(local_480.ray + 0x214) =
                   (uint)bVar41 * iVar25 | (uint)!bVar41 * *(int *)(local_480.ray + 0x214);
              *(uint *)(local_480.ray + 0x218) =
                   (uint)bVar10 * iVar26 | (uint)!bVar10 * *(int *)(local_480.ray + 0x218);
              *(uint *)(local_480.ray + 0x21c) =
                   (uint)bVar11 * iVar27 | (uint)!bVar11 * *(int *)(local_480.ray + 0x21c);
              auVar87 = vmovdqu32_avx512vl(*(undefined1 (*) [32])(local_480.hit + 0xa0));
              *(undefined1 (*) [32])(local_480.ray + 0x220) = auVar87;
              auVar87 = vmovdqu32_avx512vl(*(undefined1 (*) [32])(local_480.hit + 0xc0));
              *(undefined1 (*) [32])(local_480.ray + 0x240) = auVar87;
              auVar87 = vmovdqa32_avx512vl(*(undefined1 (*) [32])(local_480.hit + 0xe0));
              *(undefined1 (*) [32])(local_480.ray + 0x260) = auVar87;
              auVar87 = vmovdqa32_avx512vl(*(undefined1 (*) [32])(local_480.hit + 0x100));
              *(undefined1 (*) [32])(local_480.ray + 0x280) = auVar87;
              break;
            }
          }
          *(float *)(ray + k * 4 + 0x100) = fVar225;
          break;
        }
        lVar32 = lVar32 + -1;
      } while (lVar32 != 0);
      goto LAB_01ae4ed5;
    }
    auVar115 = vinsertps_avx(auVar139,auVar57,0x10);
  } while( true );
}

Assistant:

static __forceinline void intersect_n(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);

          unsigned int vertexID = geom->curve(primID);
          Vec3ff a0,a1,a2,a3; Vec3fa n0,n1,n2,n3; geom->gather(a0,a1,a2,a3,n0,n1,n2,n3,vertexID);

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }

          Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,n0,n1,n2,n3,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }